

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O1

MPP_RET vdpu_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  HalBufs *bufs;
  uint *puVar1;
  FilmGrainMemory *scaling_lut;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  anon_struct_4_11_fc3ab2b4_for_swreg3 aVar6;
  anon_struct_4_25_9d147ffd_for_swreg5 aVar7;
  anon_struct_4_5_d5c663f9_for_swreg184 aVar8;
  anon_struct_4_5_7e86ff7e_for_swreg185 aVar9;
  anon_struct_4_5_d0d94302_for_swreg186 aVar10;
  anon_struct_4_5_603a5415_for_swreg187 aVar11;
  anon_struct_4_5_bc441407_for_swreg188 aVar12;
  anon_struct_4_5_f90917a6_for_swreg257 aVar13;
  anon_struct_4_5_fe228d5b_for_swreg262 aVar14;
  anon_struct_4_6_b76789ed_for_swreg20 aVar15;
  anon_struct_4_6_034ecb4d_for_swreg21 aVar16;
  anon_struct_4_6_6b3e87ec_for_swreg22 aVar17;
  anon_struct_4_6_8162041a_for_swreg23 aVar18;
  anon_struct_4_6_8c43d0ff_for_swreg24 aVar19;
  anon_struct_4_6_1cc34941_for_swreg25 aVar20;
  anon_struct_4_6_9786faf9_for_swreg26 aVar21;
  anon_struct_4_6_a6507eae_for_swreg27 aVar22;
  anon_struct_4_14_914205bb_for_swreg7 aVar23;
  anon_struct_4_4_56b39857_for_swreg28 aVar24;
  anon_struct_4_6_c35305d8_for_swreg10 aVar25;
  anon_struct_4_6_bb133afb_for_swreg8 aVar26;
  anon_struct_4_10_0fd9c99d_for_swreg13 aVar27;
  anon_struct_4_7_653512df_for_swreg31 aVar28;
  anon_struct_4_7_66f87b3f_for_swreg32 aVar29;
  anon_struct_4_11_260badcd_for_swreg320 aVar30;
  VdpuAv1dRegCtx *ctx;
  void *pvVar31;
  anon_struct_4_6_2b336929_for_swreg14 aVar32;
  anon_struct_4_6_2cf6d189_for_swreg15 aVar33;
  anon_struct_4_6_2eba39e9_for_swreg16 aVar34;
  anon_struct_4_6_307da249_for_swreg17 aVar35;
  anon_struct_4_6_a90b2738_for_swreg18 aVar36;
  anon_struct_4_6_fc300d31_for_swreg19 aVar37;
  undefined2 uVar38;
  VdpuAv1dRegSet *pVVar39;
  RK_S8 RVar40;
  uint uVar41;
  RK_S32 max_cnt;
  RK_U32 RVar42;
  MPP_RET MVar43;
  MppFrameFormat MVar44;
  RK_U32 RVar45;
  anon_struct_4_1_125fc4d2_for_swreg67 aVar46;
  anon_struct_4_10_545f55a1_for_swreg9 aVar47;
  anon_struct_4_14_b2705f36_for_swreg11 aVar48;
  anon_struct_4_1_24a8d9ad_for_swreg81 aVar49;
  anon_struct_4_4_36e9efea_for_swreg29 aVar50;
  anon_struct_4_1_5b01d5f0_for_swreg95 aVar51;
  anon_struct_4_1_1bae43a1_for_swreg167 aVar52;
  anon_struct_4_1_4038c17b_for_swreg65 aVar53;
  anon_struct_4_1_82573765_for_swreg99 aVar54;
  anon_struct_4_1_169ba666_for_swreg133 aVar55;
  anon_struct_4_1_c37ab20f_for_swreg169 aVar56;
  anon_struct_4_1_4e3bf742_for_swreg175 aVar57;
  anon_struct_4_1_23975d0d_for_swreg177 aVar58;
  anon_struct_4_1_111c466e_for_swreg326 aVar59;
  anon_struct_4_1_6d573f12_for_swreg328 aVar60;
  anon_struct_4_1_37abd1af_for_swreg505 aVar61;
  VdpuAv1dRegCtx *pVVar62;
  size_t sVar63;
  undefined2 *puVar64;
  char *pcVar65;
  HalBuf *pHVar66;
  void *pvVar67;
  RK_S16 *pRVar68;
  byte bVar69;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  anon_struct_4_8_3e79bdc5_for_swreg59 aVar79;
  long lVar80;
  long lVar81;
  undefined1 *puVar82;
  uint *puVar83;
  char *pcVar84;
  undefined2 uVar85;
  uint uVar86;
  ulong uVar87;
  uint *puVar88;
  byte bVar89;
  byte bVar90;
  long lVar91;
  byte *pbVar92;
  uint uVar93;
  int iVar94;
  uint *puVar95;
  ulong uVar96;
  int iVar97;
  int iVar98;
  undefined2 *puVar99;
  int iVar100;
  ulong uVar101;
  RK_S32 downscaledLumaPlaneW;
  int iVar102;
  VdpuAv1dRegSet *pVVar103;
  long lVar104;
  ulong uVar105;
  ulong uVar106;
  undefined1 *puVar107;
  bool bVar108;
  bool bVar109;
  uint local_93d8;
  MppBuffer buffer;
  VdpuAv1dRegSet *local_9380;
  MppFrame mframe;
  RK_U32 local_9370;
  RK_U32 local_936c;
  MppBuffer streambuf;
  long local_9360;
  HalBuf *local_9358;
  ulong local_9350;
  RK_U8 mf_types [3];
  RK_S32 refs_selected [3];
  RK_S32 ar_coeffs_y [24];
  RK_S32 ref_count [24];
  undefined1 local_91a8;
  uint local_91a4;
  uint local_91a0;
  uint local_919c;
  uint local_9198;
  uint local_9194;
  uint local_9190;
  uint local_918c;
  undefined1 local_9188;
  uint local_9184;
  uint local_9180;
  uint local_917c;
  uint local_9178;
  uint local_9174;
  uint local_9170;
  uint local_916c;
  undefined1 local_9168;
  uint local_9164;
  uint local_9160;
  uint local_915c;
  uint local_9158;
  uint local_9154;
  uint local_9150;
  uint local_914c;
  undefined1 local_9148;
  uint local_9144;
  uint local_9140;
  uint local_913c;
  uint local_9138;
  uint local_9134;
  uint local_9130;
  uint local_912c;
  undefined1 local_9128;
  uint local_9124;
  uint local_9120;
  uint local_911c;
  uint local_9118;
  uint local_9114;
  uint local_9110;
  uint local_910c;
  uint auStack_9108 [683];
  undefined1 local_865c [20964];
  RK_S32 cur_offset [7];
  undefined1 local_3040 [5608];
  uint local_1a58 [270];
  undefined1 local_1620 [5616];
  
  ctx = *(VdpuAv1dRegCtx **)((long)hal + 0x50);
  pvVar31 = (task->dec).syntax.data;
  buffer = (MppBuffer)0x0;
  streambuf = (MppBuffer)0x0;
  uVar86 = 1 << (*(byte *)((long)pvVar31 + 0xc98) & 0x1f);
  if (hal == (void *)0x0) {
    if (((byte)hal_av1d_debug & 4) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"hal_av1d_vdpu","input empty(%d).\n",(char *)0x0,0x74e);
    return MPP_OK;
  }
  uVar3 = *(ushort *)((long)pvVar31 + 4);
  uVar4 = *(ushort *)((long)pvVar31 + 2);
  ctx->refresh_frame_flags = (uint)*(byte *)((long)pvVar31 + 0xc86);
  uVar101 = *(ulong *)((long)task + 8);
  if ((uVar101 & 0xc) != 0) {
    _mpp_log_l(2,"hal_av1d_vdpu","parse err %d ref err %d\n","vdpu_av1d_gen_regs",
               (ulong)((uint)(uVar101 >> 2) & 1),(ulong)((uint)uVar101 >> 3 & 1));
    return MPP_OK;
  }
  if (*(int *)((long)hal + 0x58) != 0) {
    lVar80 = 0;
    pVVar62 = ctx;
    do {
      if (pVVar62->reg_buf[0].valid == 0) {
        (task->dec).reg_index = (RK_S32)lVar80;
        ctx->regs = pVVar62->reg_buf[0].regs;
        pVVar62->reg_buf[0].valid = 1;
        break;
      }
      lVar80 = lVar80 + 1;
      pVVar62 = (VdpuAv1dRegCtx *)(pVVar62->reg_buf + 1);
    } while (lVar80 != 3);
  }
  pVVar103 = ctx->regs;
  memset(pVVar103,0,0x800);
  lVar80 = *(long *)((long)hal + 0x50);
  uVar41 = (uint)*(ushort *)((long)pvVar31 + 0xe) * (uint)*(ushort *)((long)pvVar31 + 6) + 0x7f >> 3
           & 0xffffff0;
  uVar70 = (*(ushort *)((long)pvVar31 + 8) + 0xf & 0xfffffff0) * uVar41;
  uVar101 = (ulong)((uVar70 >> 1) +
                    ((*(ushort *)((long)pvVar31 + 6) + 0x3f >> 6) * 0x300 + 0x300) *
                    ((*(ushort *)((long)pvVar31 + 8) + 0x3f >> 6) + 1) + uVar70 + 0x200);
  if (*(ulong *)(lVar80 + 0x1e7c0) < uVar101) {
    *(uint *)(lVar80 + 0x1b470) = uVar41;
    *(uint *)(lVar80 + 0x1b478) = uVar70;
    *(uint *)(lVar80 + 0x1b47c) = uVar70 >> 1;
    *(ulong *)(lVar80 + 0x1e7c0) = uVar101;
    bufs = (HalBufs *)(lVar80 + 0x1e7b0);
    if (*(HalBufs *)(lVar80 + 0x1e7b0) != (HalBufs)0x0) {
      hal_bufs_deinit(*(HalBufs *)(lVar80 + 0x1e7b0));
      *bufs = (HalBufs)0x0;
    }
    hal_bufs_init(bufs);
    if (*bufs == (HalBufs)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","tile out bufs init fail\n","vdpu_av1d_setup_tile_bufs");
    }
    else {
      max_cnt = mpp_buf_slot_get_count(*(MppBufSlots *)((long)hal + 0x20));
      *(RK_S32 *)(lVar80 + 0x1e7b8) = max_cnt;
      hal_bufs_setup(*(HalBufs *)(lVar80 + 0x1e7b0),max_cnt,1,(size_t *)(lVar80 + 0x1e7c0));
    }
  }
  if (ctx->filter_mem == (MppBuffer)0x0) {
LAB_002191b2:
    uVar41 = *(ushort *)((long)pvVar31 + 4) + 0x3f;
    uVar70 = uVar41 & 0xffffffc0;
    uVar41 = uVar41 >> 6;
    bVar89 = *(byte *)((long)pvVar31 + 0xc98);
    ctx->filt_info[0].offset = 0;
    uVar93 = uVar70 * 0xf + 0x7f & 0x3fff80;
    ctx->filt_info[0].size = uVar93;
    iVar94 = uVar93 + uVar70 * 8;
    ctx->filt_info[1].offset = uVar93 << (bVar89 & 0x1f);
    ctx->filt_info[1].size = uVar70 << 3;
    ctx->filt_info[2].offset = iVar94 << (bVar89 & 0x1f);
    uVar93 = uVar41 * 0x370 + 0x7f & 0xffffff80;
    ctx->filt_info[2].size = uVar93;
    iVar94 = uVar93 + iVar94;
    ctx->filt_info[3].offset = iVar94 << (bVar89 & 0x1f);
    uVar41 = uVar41 * 0x10e0 + 0x7f & 0xffffff80;
    ctx->filt_info[3].size = uVar41;
    iVar94 = uVar41 + iVar94;
    ctx->filt_info[4].offset = iVar94 << (bVar89 & 0x1f);
    RVar42 = (uVar70 + 0x47 >> 6) * 0x780;
    ctx->filt_info[4].size = RVar42;
    MVar43 = mpp_buffer_get_with_tag
                       (*(MppBufferGroup *)((long)hal + 0x38),&ctx->filter_mem,
                        (ulong)((iVar94 + RVar42 << (bVar89 & 0x1f)) + 0xfff & 0xfffff000),
                        "hal_av1d_vdpu","vdpu_av1d_filtermem_alloc");
    if (MVar43 != MPP_OK) {
      _mpp_log_l(2,"hal_av1d_vdpu","filt buffer get fail\n",(char *)0x0);
      vdpu_av1d_filtermem_release(ctx);
    }
  }
  else if ((ctx->height < (uint)uVar3) || (ctx->num_tile_cols < uVar86)) {
    if (ctx->filter_mem != (MppBuffer)0x0) {
      vdpu_av1d_filtermem_release(ctx);
    }
    goto LAB_002191b2;
  }
  ctx->width = (uint)uVar4;
  ctx->height = (uint)uVar3;
  ctx->num_tile_cols = uVar86;
  local_9350 = (ulong)uVar4;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_FRAME_PTR,&mframe);
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),(task->dec).output,SLOT_BUFFER,&buffer);
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x28),(task->dec).input,SLOT_BUFFER,&streambuf)
  ;
  local_9358 = hal_bufs_get_buf(ctx->tile_out_bufs,(task->dec).output);
  local_936c = mpp_frame_get_hor_stride(mframe);
  local_9370 = mpp_frame_get_ver_stride(mframe);
  ctx->ver_stride = local_9370;
  sVar63 = mpp_packet_get_length((task->dec).input_packet);
  *(int *)((long)hal + 0x10) = (int)sVar63;
  MVar44 = mpp_frame_get_fmt(mframe);
  ctx->fbc_en = (MVar44 & 0xf00000) != MPP_FMT_YUV420SP;
  local_9380 = pVVar103;
  if (((byte)hal_av1d_debug & 8) != 0) {
    uVar4 = *(ushort *)((long)pvVar31 + 0xe);
    MVar44 = mpp_frame_get_fmt(mframe);
    pVVar103 = local_9380;
    _mpp_log_l(4,"hal_av1d_vdpu","bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
               (char *)0x0,(ulong)uVar4,(ulong)MVar44,(ulong)*(byte *)((long)pvVar31 + 0x52b),
               (ulong)*(byte *)((long)pvVar31 + 0x52c),(ulong)ctx->width,(ulong)ctx->height,
               (ulong)(uint)ctx->hor_stride,(ulong)(uint)ctx->ver_stride);
  }
  pVVar103->swreg1 =
       (anon_struct_4_23_b69a4f09_for_swreg1)(((uint)pVVar103->swreg1 & 0xffffff5e) + 1);
  puVar82 = &(pVVar103->swreg2).field_0x1;
  *puVar82 = *puVar82 | 4;
  aVar6 = pVVar103->swreg3;
  pVVar103->swreg3 = (anon_struct_4_11_fc3ab2b4_for_swreg3)((uint)aVar6 & 0x7ffffff | 0x88000000);
  pVVar103->swreg3 =
       (anon_struct_4_11_fc3ab2b4_for_swreg3)
       (((uint)aVar6 & 0x3feeeff | 0x88000000) +
        ((uint)(*(ulong *)((long)pvVar31 + 0x14) >> 6) & 0x4000000) + 0x1100);
  aVar7 = pVVar103->swreg5;
  uVar86 = (uint)(*(ulong *)((long)pvVar31 + 0x14) >> 0x1b) & 0x800;
  pVVar103->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar7 & 0xfffff7ff | uVar86);
  uVar41 = (*(byte *)((long)pvVar31 + 0x53b) & 3) << 0x17;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar7 & 0xfe7ff7ff | uVar86 | uVar41);
  uVar70 = (*(byte *)((long)pvVar31 + 0x539) & 1) << 0x16;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar7 & 0xfe3ff7ff | uVar86 | uVar41 | uVar70);
  uVar93 = (*(byte *)((long)pvVar31 + 0x53a) & 1) << 0x15;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfe1ff7ff | uVar86 | uVar41 | uVar70 | uVar93);
  uVar71 = *(uint *)((long)pvVar31 + 0x14) >> 0xb & 0x80000;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfe17f7ff | uVar86 | uVar41 | uVar70 | uVar93 | uVar71);
  aVar7 = (anon_struct_4_25_9d147ffd_for_swreg5)
          (((uint)aVar7 & 0xfe13f7ff | uVar86 | uVar41 | uVar70 | uVar93 | uVar71) +
          (*(uint *)((long)pvVar31 + 0x14) & 0x10000) * 4);
  pVVar103->swreg5 = aVar7;
  uVar86 = (*(byte *)((long)pvVar31 + 0x529) & 1) << 0x10;
  pVVar103->swreg5 = (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar7 & 0xfffeffff | uVar86);
  uVar41 = *(uint *)((long)pvVar31 + 0x14) >> 0xc & 0x8000;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar7 & 0xfffe7fff | uVar86 | uVar41);
  uVar70 = 0x4000;
  if ((((*(char *)((long)pvVar31 + 0x559) == '\0') && (*(char *)((long)pvVar31 + 0x558) == '\0')) &&
      (*(char *)((long)pvVar31 + 0x55a) == '\0')) &&
     ((*(char *)((long)pvVar31 + 0x55b) == '\0' && (*(char *)((long)pvVar31 + 0x56a) == '\0')))) {
    uVar70 = (uint)(*(char *)((long)pvVar31 + 0x56b) != '\0') << 0xe;
  }
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)((uint)aVar7 & 0xfffe3fff | uVar86 | uVar41 | uVar70);
  uVar93 = *(uint *)((long)pvVar31 + 0x14) >> 2 & 0x2000;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe1fff | uVar86 | uVar41 | uVar70 | uVar93);
  uVar71 = *(uint *)((long)pvVar31 + 0x14) >> 2 & 0x1000;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe0fff | uVar86 | uVar41 | uVar70 | uVar93 | uVar71);
  uVar72 = *(uint *)((long)pvVar31 + 0x14) >> 3 & 0x400;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe0bff | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72);
  uVar73 = *(uint *)((long)pvVar31 + 0x14) >> 0x13 & 0x200;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe09ff | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72 | uVar73);
  uVar74 = *(uint *)((long)pvVar31 + 0x14) >> 10 & 0x100;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe08ff | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72 | uVar73 |
       uVar74);
  uVar75 = *(uint *)((long)pvVar31 + 0x14) >> 10 & 0x80;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe087f | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72 | uVar73 |
        uVar74 | uVar75);
  uVar76 = (uint)(*(ulong *)((long)pvVar31 + 0x14) >> 0x1b) & 0x40;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe083f | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72 | uVar73 |
        uVar74 | uVar75 | uVar76);
  uVar77 = *(uint *)((long)pvVar31 + 0x14) >> 0xe & 0x20;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe081f | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72 | uVar73 |
        uVar74 | uVar75 | uVar76 | uVar77);
  uVar78 = *(uint *)((long)pvVar31 + 0x14) >> 0x15 & 0x10;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe080f | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72 | uVar73 |
        uVar74 | uVar75 | uVar76 | uVar77 | uVar78);
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)aVar7 & 0xfffe0807 | uVar86 | uVar41 | uVar70 | uVar93 | uVar71 | uVar72 | uVar73 |
        uVar74 | uVar75 | uVar76 | uVar77 | uVar78 | *(uint *)((long)pvVar31 + 0x14) >> 0x11 & 8);
  lVar80 = *(long *)((long)hal + 0x50);
  lVar81 = *(long *)(lVar80 + 0x1e7a8);
  puVar64 = (undefined2 *)
            mpp_buffer_get_ptr_with_caller
                      (*(MppBuffer *)(lVar80 + 0x50),"vdpu_av1d_set_global_model");
  puVar1 = (uint *)((long)pvVar31 + 0x774);
  puVar88 = (uint *)((long)pvVar31 + 0x7a8);
  uVar101 = 0;
  do {
    lVar104 = uVar101 * 0x6c;
    if ((3 < *(byte *)((long)pvVar31 + lVar104 + 0x7a6)) &&
       (_mpp_log_l(2,"hal_av1d_vdpu","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "dxva->frame_refs[ref_frame].wmtype <= 3","vdpu_av1d_set_global_model",0x59d),
       (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    lVar91 = 0;
    puVar83 = puVar88;
    puVar64 = puVar64 + 4;
    do {
      puVar99 = puVar64;
      puVar95 = puVar1 + uVar101 * 0x1b + 0x10;
      if (((int)lVar91 != 2) && (puVar95 = puVar1 + uVar101 * 0x1b + 0xf, (int)lVar91 != 3)) {
        puVar95 = puVar83;
      }
      *(uint *)(puVar99 + -4) = *puVar95;
      lVar91 = lVar91 + 1;
      puVar83 = puVar83 + 1;
      puVar64 = puVar99 + 2;
    } while (lVar91 != 6);
    puVar99[-2] = (short)puVar1[uVar101 * 0x1b + 0x19];
    puVar99[-1] = *(undefined2 *)((long)puVar1 + lVar104 + 0x66);
    *puVar99 = (short)puVar1[uVar101 * 0x1b + 0x1a];
    puVar99[1] = *(undefined2 *)((long)puVar1 + lVar104 + 0x6a);
    if (((byte)hal_av1d_debug & 8) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu","ref_frame[%d] alpa %d beta %d gamma %d delta %d\n",(char *)0x0,
                 uVar101 & 0xffffffff,(ulong)(ushort)puVar1[uVar101 * 0x1b + 0x19],
                 (ulong)*(ushort *)((long)puVar1 + lVar104 + 0x66),
                 (ulong)(ushort)puVar1[uVar101 * 0x1b + 0x1a],
                 (ulong)*(ushort *)((long)puVar1 + lVar104 + 0x6a));
    }
    uVar101 = uVar101 + 1;
    puVar88 = puVar88 + 0x1b;
  } while (uVar101 != 7);
  uVar41 = 0;
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar80 + 0x50),0,"vdpu_av1d_set_global_model");
  *(undefined4 *)(lVar81 + 0x148) = 0;
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x50),"vdpu_av1d_set_global_model")
  ;
  *(int *)(lVar81 + 0x14c) = iVar94;
  lVar80 = *(long *)((long)hal + 0x50);
  cVar2 = *(char *)(lVar80 + 0x1e783);
  iVar94 = *(int *)((long)pvVar31 + 0xc80);
  iVar102 = *(int *)((long)hal + 0x10);
  iVar97 = *(int *)((long)pvVar31 + 0xc7c);
  pcVar65 = (char *)mpp_buffer_get_ptr_with_caller
                              (*(MppBuffer *)(lVar80 + 0x40),"vdpu_av1d_set_tile_info_mem");
  uVar86 = (uint)*(ushort *)((long)pvVar31 + (ulong)(cVar2 == '\0') * 2 + 0x1c);
  uVar4 = *(ushort *)((long)pvVar31 + (ulong)(cVar2 != '\0') * 2 + 0x1c);
  uVar5 = *(ushort *)((long)pvVar31 + 0x1c);
  if (uVar5 == 0) {
    uVar101 = 0;
    uVar70 = 0;
  }
  else {
    uVar70 = 0;
    uVar105 = 0;
    do {
      ref_count[uVar105] = uVar70;
      uVar70 = (uint)(byte)((char)uVar70 + *(char *)((long)pvVar31 + uVar105 * 2 + 0x22));
      bVar89 = (char)uVar105 + 1;
      uVar105 = (ulong)bVar89;
      uVar101 = (ulong)bVar89;
    } while (bVar89 < uVar5);
  }
  ref_count[uVar101] = uVar70;
  uVar5 = *(ushort *)((long)pvVar31 + 0x1e);
  if (uVar5 == 0) {
    uVar101 = 0;
  }
  else {
    bVar89 = 0;
    uVar105 = 0;
    do {
      auStack_9108[uVar105] = (uint)bVar89;
      bVar89 = bVar89 + *(char *)((long)pvVar31 + uVar105 * 2 + 0xa2);
      bVar90 = (char)uVar105 + 1;
      uVar105 = (ulong)bVar90;
      uVar101 = (ulong)bVar90;
    } while (bVar90 < uVar5);
    uVar41 = (uint)bVar89;
  }
  auStack_9108[uVar101] = uVar41;
  local_9360 = lVar80;
  if (uVar86 != 0) {
    uVar41 = iVar102 - (iVar94 + iVar97);
    iVar94 = 0;
    uVar70 = 0;
    bVar109 = false;
    do {
      if (uVar4 != 0) {
        uVar101 = 0;
        uVar93 = uVar70;
        do {
          pcVar84 = pcVar65;
          bVar108 = cVar2 == '\0';
          uVar105 = uVar101;
          if (bVar108) {
            uVar105 = (ulong)uVar70;
          }
          uVar87 = (ulong)uVar70;
          if (bVar108) {
            uVar87 = uVar101;
          }
          uVar71 = iVar94 + (int)uVar101;
          if (!bVar108) {
            uVar71 = uVar93;
          }
          uVar72 = auStack_9108[uVar105];
          uVar73 = auStack_9108[uVar105 + 1];
          uVar74 = ref_count[uVar87];
          uVar75 = ref_count[uVar87 + 1];
          if (!bVar109) {
            bVar89 = 1;
            if (((((int)uVar87 != *(ushort *)((long)pvVar31 + 0x1c) - 1) &&
                 (((uint)*(ulong *)((long)pvVar31 + 0x14) >> 0xc & 1) == 0)) &&
                (uVar75 - uVar74 == 1)) &&
               (((*(ulong *)((long)pvVar31 + 0x14) & 0x400000000) != 0 &&
                (bVar89 = 0, ((byte)hal_av1d_debug & 8) != 0)))) {
              bVar89 = 0;
              _mpp_log_l(4,"hal_av1d_vdpu","WARNING: Superres used and tile width == 64\n",
                         (char *)0x0);
            }
            uVar105 = *(ulong *)((long)pvVar31 + 0x14);
            iVar102 = uVar75 - uVar74 << (((uint)uVar105 >> 0xc & 1) == 0 ^ 7U);
            if ((uVar105 & 0x400000000) != 0) {
              uVar76 = (*(ushort *)((long)pvVar31 + 0xc) + 9) * iVar102;
              uVar77 = uVar76 | 4;
              uVar76 = uVar76 + 0xb;
              if (-1 < (int)uVar77) {
                uVar76 = uVar77;
              }
              iVar102 = (int)uVar76 >> 3;
            }
            if ((0x1000 < iVar102) && (bVar89 = 0, ((byte)hal_av1d_debug & 8) != 0)) {
              pcVar65 = "WARNING: Tile width after superres > 4096\n";
              if ((uVar105 & 0x400000000) == 0) {
                pcVar65 = "WARNING: Tile width > 4096\n";
              }
              bVar89 = 0;
              _mpp_log_l(4,"hal_av1d_vdpu",pcVar65,(char *)0x0);
            }
            bVar109 = (bool)(bVar89 ^ 1);
          }
          bVar89 = 7 - ((*(byte *)((long)pvVar31 + 0x15) & 0x10) == 0);
          if (((uint)*(ushort *)((long)pvVar31 + 2) <= uVar74 << (bVar89 & 0x1f)) ||
             ((uint)*(ushort *)((long)pvVar31 + 4) <= uVar72 << (bVar89 & 0x1f))) {
            bVar109 = true;
          }
          *pcVar84 = (char)uVar75 - (char)uVar74;
          pcVar84[1] = '\0';
          pcVar84[2] = '\0';
          pcVar84[3] = '\0';
          pcVar84[4] = (char)uVar73 - (char)uVar72;
          pcVar84[5] = '\0';
          pcVar84[6] = '\0';
          pcVar84[7] = '\0';
          uVar76 = *(uint *)((long)pvVar31 + (ulong)uVar71 * 4 + 0x124);
          bVar108 = uVar41 < uVar76 + 1;
          if (bVar109) {
            bVar108 = bVar109;
          }
          *(uint *)(pcVar84 + 8) = uVar76;
          uVar71 = *(uint *)((long)pvVar31 + (ulong)uVar71 * 4 + 0x324);
          *(uint *)(pcVar84 + 0xc) = uVar71;
          bVar109 = uVar41 < uVar71;
          if (bVar108) {
            bVar109 = bVar108;
          }
          if (((byte)hal_av1d_debug & 8) != 0) {
            _mpp_log_l(4,"hal_av1d_vdpu",
                       "tile_info[%d][%d]: start=%08x end=%08x x0:x1=%d:%d y0:y1=%d:%d\n",
                       (char *)0x0,(ulong)uVar70,uVar101,(ulong)uVar76,(ulong)uVar71,(ulong)uVar74,
                       (ulong)uVar75,(ulong)uVar72,(ulong)uVar73);
          }
          uVar71 = (int)uVar101 + 1;
          uVar101 = (ulong)uVar71;
          uVar93 = uVar93 + uVar86;
          pcVar65 = pcVar84 + 0x10;
        } while (uVar4 != uVar71);
        pcVar65 = pcVar84 + 0x10;
      }
      uVar70 = uVar70 + 1;
      iVar94 = iVar94 + (uint)uVar4;
    } while (uVar70 != uVar86);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(local_9360 + 0x40),0,"vdpu_av1d_set_tile_info_mem");
  if (((*(byte *)((long)pvVar31 + 0x528) & 0xfd) == 0) &&
     ((*(byte *)((long)pvVar31 + 0x17) & 2) == 0)) goto LAB_0021b5a3;
  pVVar103 = ctx->regs;
  ref_count[0x14] = 0;
  ref_count[0x15] = 0;
  ref_count[0x16] = 0;
  ref_count[0x17] = 0;
  ref_count[0x10] = 0;
  ref_count[0x11] = 0;
  ref_count[0x12] = 0;
  ref_count[0x13] = 0;
  ref_count[0xc] = 0;
  ref_count[0xd] = 0;
  ref_count[0xe] = 0;
  ref_count[0xf] = 0;
  ref_count[8] = 0;
  ref_count[9] = 0;
  ref_count[10] = 0;
  ref_count[0xb] = 0;
  ref_count[4] = 0;
  ref_count[5] = 0;
  ref_count[6] = 0;
  ref_count[7] = 0;
  ref_count[0] = 0;
  ref_count[1] = 0;
  ref_count[2] = 0;
  ref_count[3] = 0;
  RVar42 = ctx->luma_size;
  RVar45 = ctx->chroma_size;
  if ((*(byte *)((long)pvVar31 + 0x17) & 2) == 0) {
    lVar80 = 0;
    do {
      lVar81 = (long)*(char *)((long)pvVar31 + lVar80 + 0x7a4);
      if (-1 < lVar81) {
        ref_count[lVar81] = ref_count[lVar81] + 1;
      }
      lVar80 = lVar80 + 0x6c;
    } while (lVar80 != 0x2f4);
    lVar80 = 0;
    do {
      if (ref_count[lVar80] != 0) {
        pVVar103->swreg4 =
             (anon_struct_4_4_dea6aa23_for_swreg4)
             ((uint)pVVar103->swreg4 & 0xfffffff0 | (int)pVVar103->swreg4 + 1U & 0xf);
      }
      lVar80 = lVar80 + 1;
    } while (lVar80 != 0x18);
  }
  else {
    pVVar103->swreg4 =
         (anon_struct_4_4_dea6aa23_for_swreg4)(((uint)pVVar103->swreg4 & 0xfffffff0) + 1);
  }
  uVar4 = *(ushort *)((long)pvVar31 + 2);
  uVar5 = *(ushort *)((long)pvVar31 + 4);
  lVar80 = *(long *)((long)hal + 0x50);
  if ((*(char *)((long)pvVar31 + 0x531) == '\0') || ((*(byte *)((long)pvVar31 + 0x528) & 0xfd) == 0)
     ) {
    *(undefined8 *)(lVar80 + 0x1e794) = 0;
    *(undefined8 *)(lVar80 + 0x1e79c) = 0;
    *(undefined8 *)(lVar80 + 0x1e784) = 0;
    *(undefined8 *)(lVar80 + 0x1e78c) = 0;
  }
  else {
    puVar88 = (uint *)((long)pvVar31 + 0x77c);
    uVar101 = 0;
    do {
      if (-1 < (char)puVar88[10]) {
        uVar86 = *puVar88;
        bVar89 = *(byte *)((long)pvVar31 + 0x530);
        if (*(char *)((long)pvVar31 + 0x531) == '\0') {
          uVar41 = 0;
        }
        else {
          uVar70 = 1 << (*(char *)((long)pvVar31 + 0x531) - 1U & 0x1f);
          uVar41 = uVar86 - bVar89;
          uVar41 = (uint)((int)(uVar70 & uVar41) < (int)(uVar70 - 1 & uVar41));
        }
        *(uint *)(lVar80 + 0x1e788 + uVar101 * 4) = uVar41;
        if (((byte)hal_av1d_debug & 8) != 0) {
          _mpp_log_l(4,"hal_av1d_vdpu","frame_refs[%d] order_hint %d ref_frame_offset %d\n",
                     (char *)0x0,uVar101 & 0xffffffff,(ulong)bVar89,(ulong)uVar86);
        }
      }
      uVar101 = uVar101 + 1;
      puVar88 = puVar88 + 0x1b;
    } while (uVar101 != 7);
  }
  RVar45 = RVar42 + RVar45 + 0x40;
  bVar109 = false;
  local_93d8 = 0;
  puVar88 = puVar1;
  uVar101 = 0;
  do {
    if ((*(byte *)((long)pvVar31 + 0x17) & 2) == 0) {
      bVar89 = (byte)puVar88[0xc];
      if ((char)bVar89 < '\x01') {
        bVar89 = 0;
      }
      uVar70 = (uint)bVar89;
      uVar86 = *puVar88;
      uVar41 = puVar88[1];
    }
    else {
      uVar70 = (uint)*(ushort *)((long)pvVar31 + 10);
      uVar86 = (uint)uVar4;
      uVar41 = (uint)uVar5;
    }
    uVar105 = uVar101 + 1;
    uVar85 = (undefined2)uVar86;
    switch(uVar101 & 0xffffffff) {
    case 0:
      *(undefined2 *)&(pVVar103->swreg33).field_0x2 = uVar85;
      break;
    case 1:
      *(undefined2 *)&(pVVar103->swreg34).field_0x2 = uVar85;
      break;
    case 2:
      *(undefined2 *)&(pVVar103->swreg35).field_0x2 = uVar85;
      break;
    case 3:
      *(undefined2 *)&(pVVar103->swreg43).field_0x2 = uVar85;
      break;
    case 4:
      *(undefined2 *)&(pVVar103->swreg44).field_0x2 = uVar85;
      break;
    case 5:
      *(undefined2 *)&(pVVar103->swreg45).field_0x2 = uVar85;
      break;
    case 6:
      *(undefined2 *)&(pVVar103->swreg46).field_0x2 = uVar85;
      break;
    default:
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
    }
    uVar85 = (undefined2)uVar41;
    switch(uVar101 & 0xffffffff) {
    case 0:
      *(undefined2 *)&pVVar103->swreg33 = uVar85;
      break;
    case 1:
      *(undefined2 *)&pVVar103->swreg34 = uVar85;
      break;
    case 2:
      *(undefined2 *)&pVVar103->swreg35 = uVar85;
      break;
    case 3:
      *(undefined2 *)&pVVar103->swreg43 = uVar85;
      break;
    case 4:
      *(undefined2 *)&pVVar103->swreg44 = uVar85;
      break;
    case 5:
      *(undefined2 *)&pVVar103->swreg45 = uVar85;
      break;
    case 6:
      *(undefined2 *)&pVVar103->swreg46 = uVar85;
      break;
    default:
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
    }
    uVar87 = (ulong)(uVar86 * 0x4000 + (uint)(uVar4 >> 1)) / (ulong)(uint)uVar4;
    uVar85 = (undefined2)uVar87;
    uVar106 = (ulong)(uVar41 * 0x4000 + (uint)(uVar5 >> 1)) / (ulong)(uint)uVar5;
    uVar38 = (undefined2)uVar106;
    switch(uVar101 & 0xffffffff) {
    case 0:
      *(undefined2 *)&(pVVar103->swreg36).field_0x2 = uVar85;
      break;
    case 1:
      *(undefined2 *)&(pVVar103->swreg37).field_0x2 = uVar85;
      break;
    case 2:
      *(undefined2 *)&(pVVar103->swreg38).field_0x2 = uVar85;
      break;
    case 3:
      *(undefined2 *)&(pVVar103->swreg39).field_0x2 = uVar85;
      break;
    case 4:
      *(undefined2 *)&(pVVar103->swreg40).field_0x2 = uVar85;
      break;
    case 5:
      *(undefined2 *)&(pVVar103->swreg41).field_0x2 = uVar85;
      break;
    case 6:
      *(undefined2 *)&(pVVar103->swreg42).field_0x2 = uVar85;
      break;
    default:
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
    }
    switch(uVar101 & 0xffffffff) {
    case 0:
      *(undefined2 *)&pVVar103->swreg36 = uVar38;
      break;
    case 1:
      *(undefined2 *)&pVVar103->swreg37 = uVar38;
      break;
    case 2:
      *(undefined2 *)&pVVar103->swreg38 = uVar38;
      break;
    case 3:
      *(undefined2 *)&pVVar103->swreg39 = uVar38;
      break;
    case 4:
      *(undefined2 *)&pVVar103->swreg40 = uVar38;
      break;
    case 5:
      *(undefined2 *)&pVVar103->swreg41 = uVar38;
      break;
    case 6:
      *(undefined2 *)&pVVar103->swreg42 = uVar38;
      break;
    default:
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
    }
    if ((int)uVar106 != 0x4000 || (int)uVar87 != 0x4000) {
      local_93d8 = 1;
    }
    if (uVar70 == (int)ctx->prev_out_buffer_i) {
      bVar109 = true;
    }
    pHVar66 = hal_bufs_get_buf(ctx->tile_out_bufs,uVar70);
    if (pHVar66 == (HalBuf *)0x0) {
      pcVar84 = "get slots frame buff fail";
      pcVar65 = "set_ref_lum_base";
LAB_0021a0cf:
      _mpp_log_l(2,"hal_av1d_vdpu",pcVar84,pcVar65);
    }
    else {
      aVar46 = (anon_struct_4_1_125fc4d2_for_swreg67)
               mpp_buffer_get_fd_with_caller(*pHVar66->buf,"set_ref_lum_base");
      switch(uVar101 & 0xffffffff) {
      case 0:
        (pVVar103->addr_cfg).swreg67 = aVar46;
        break;
      case 1:
        (pVVar103->addr_cfg).swreg69 = (anon_struct_4_1_a7447793_for_swreg69)aVar46;
        break;
      case 2:
        (pVVar103->addr_cfg).swreg71 = (anon_struct_4_1_3c292a54_for_swreg71)aVar46;
        break;
      case 3:
        (pVVar103->addr_cfg).swreg73 = (anon_struct_4_1_d10ddd15_for_swreg73)aVar46;
        break;
      case 4:
        (pVVar103->addr_cfg).swreg75 = (anon_struct_4_1_65f28fd6_for_swreg75)aVar46;
        break;
      case 5:
        (pVVar103->addr_cfg).swreg77 = (anon_struct_4_1_fad74297_for_swreg77)aVar46;
        break;
      case 6:
        (pVVar103->addr_cfg).swreg79 = (anon_struct_4_1_8fbbf558_for_swreg79)aVar46;
        break;
      default:
        pcVar84 = "Error: trying to set invalid reference index.";
        pcVar65 = (char *)0x0;
        goto LAB_0021a0cf;
      }
    }
    lVar80 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
    pHVar66 = hal_bufs_get_buf(ctx->tile_out_bufs,uVar70);
    if (pHVar66 == (HalBuf *)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","get slots frame buff fail","set_ref_cb_base");
    }
    else {
      iVar94 = mpp_buffer_get_fd_with_caller(*pHVar66->buf,"set_ref_cb_base");
      switch(uVar101 & 0xffffffff) {
      case 0:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x65,RVar42);
        *(int *)(lVar80 + 0x194) = iVar94;
        break;
      case 1:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x67,RVar42);
        *(int *)(lVar80 + 0x19c) = iVar94;
        break;
      case 2:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x69,RVar42);
        *(int *)(lVar80 + 0x1a4) = iVar94;
        break;
      case 3:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x6b,RVar42);
        *(int *)(lVar80 + 0x1ac) = iVar94;
        break;
      case 4:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x6d,RVar42);
        *(int *)(lVar80 + 0x1b4) = iVar94;
        break;
      case 5:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x6f,RVar42);
        *(int *)(lVar80 + 0x1bc) = iVar94;
        break;
      case 6:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x71,RVar42);
        *(int *)(lVar80 + 0x1c4) = iVar94;
        break;
      default:
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
      }
    }
    lVar80 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
    pHVar66 = hal_bufs_get_buf(ctx->tile_out_bufs,uVar70);
    if (pHVar66 == (HalBuf *)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu","get slots frame buff fail","set_ref_dbase");
    }
    else {
      iVar94 = mpp_buffer_get_fd_with_caller(*pHVar66->buf,"set_ref_dbase");
      switch(uVar101 & 0xffffffff) {
      case 0:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x87,RVar45);
        *(int *)(lVar80 + 0x21c) = iVar94;
        break;
      case 1:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x89,RVar45);
        *(int *)(lVar80 + 0x224) = iVar94;
        break;
      case 2:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x8b,RVar45);
        *(int *)(lVar80 + 0x22c) = iVar94;
        break;
      case 3:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x8d,RVar45);
        *(int *)(lVar80 + 0x234) = iVar94;
        break;
      case 4:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x8f,RVar45);
        *(int *)(lVar80 + 0x23c) = iVar94;
        break;
      case 5:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x91,RVar45);
        *(int *)(lVar80 + 0x244) = iVar94;
        break;
      case 6:
        mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x93,RVar45);
        *(int *)(lVar80 + 0x24c) = iVar94;
        break;
      default:
        _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
      }
    }
    switch(uVar101 & 0xffffffff) {
    case 0:
      (pVVar103->addr_cfg).swreg66 = (anon_struct_4_1_125fc893_for_swreg66)0x0;
      break;
    case 1:
      (pVVar103->addr_cfg).swreg68 = (anon_struct_4_1_a7447b54_for_swreg68)0x0;
      break;
    case 2:
      (pVVar103->addr_cfg).swreg70 = (anon_struct_4_1_3c292e15_for_swreg70)0x0;
      break;
    case 3:
      (pVVar103->addr_cfg).swreg72 = (anon_struct_4_1_d10de0d6_for_swreg72)0x0;
      break;
    case 4:
      (pVVar103->addr_cfg).swreg74 = (anon_struct_4_1_65f29397_for_swreg74)0x0;
      break;
    case 5:
      (pVVar103->addr_cfg).swreg76 = (anon_struct_4_1_fad74658_for_swreg76)0x0;
      break;
    case 6:
      (pVVar103->addr_cfg).swreg78 = (anon_struct_4_1_8fbbf919_for_swreg78)0x0;
      break;
    default:
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
    }
    switch(uVar101 & 0xffffffff) {
    case 0:
      (pVVar103->addr_cfg).swreg100 = (anon_struct_4_1_547e3e7d_for_swreg100)0x0;
      break;
    case 1:
      (pVVar103->addr_cfg).swreg102 = (anon_struct_4_1_e962f13e_for_swreg102)0x0;
      break;
    case 2:
      (pVVar103->addr_cfg).swreg104 = (anon_struct_4_1_7e47a3ff_for_swreg104)0x0;
      break;
    case 3:
      (pVVar103->addr_cfg).swreg106 = (anon_struct_4_1_132c56c0_for_swreg106)0x0;
      break;
    case 4:
      (pVVar103->addr_cfg).swreg108 = (anon_struct_4_1_a8110981_for_swreg108)0x0;
      break;
    case 5:
      (pVVar103->addr_cfg).swreg110 = (anon_struct_4_1_3cf5bc42_for_swreg110)0x0;
      break;
    case 6:
      (pVVar103->addr_cfg).swreg112 = (anon_struct_4_1_d1da6f03_for_swreg112)0x0;
      break;
    default:
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
    }
    switch(uVar101 & 0xffffffff) {
    case 0:
      (pVVar103->addr_cfg).swreg134 = (anon_struct_4_1_e8c2ad7e_for_swreg134)0x0;
      break;
    case 1:
      (pVVar103->addr_cfg).swreg136 = (anon_struct_4_1_7da7603f_for_swreg136)0x0;
      break;
    case 2:
      (pVVar103->addr_cfg).swreg138 = (anon_struct_4_1_128c1300_for_swreg138)0x0;
      break;
    case 3:
      (pVVar103->addr_cfg).swreg140 = (anon_struct_4_1_a770c5c1_for_swreg140)0x0;
      break;
    case 4:
      (pVVar103->addr_cfg).swreg142 = (anon_struct_4_1_3c557882_for_swreg142)0x0;
      break;
    case 5:
      (pVVar103->addr_cfg).swreg144 = (anon_struct_4_1_d13a2b43_for_swreg144)0x0;
      break;
    case 6:
      (pVVar103->addr_cfg).swreg146 = (anon_struct_4_1_661ede04_for_swreg146)0x0;
      break;
    default:
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
    }
    if (6 < (uint)uVar101) {
      _mpp_log_l(2,"hal_av1d_vdpu","Error: trying to set invalid reference index.",(char *)0x0);
      goto LAB_0021a693;
    }
    uVar86 = ctx->ref_frame_sign_bias[uVar101 + 1];
    switch(uVar101 & 0xffffffff) {
    case 0:
      uVar86 = (uVar86 & 1) << 0x1c;
      aVar79 = pVVar103->swreg59;
      uVar41 = 0xefffffff;
      break;
    case 1:
      uVar86 = (uVar86 & 1) << 0x1d;
      aVar79 = pVVar103->swreg59;
      uVar41 = 0xdfffffff;
      break;
    case 2:
      uVar86 = (uVar86 & 1) << 0x1e;
      aVar79 = pVVar103->swreg59;
      uVar41 = 0xbfffffff;
      break;
    case 3:
      uVar86 = uVar86 << 0x1f;
      aVar79 = pVVar103->swreg59;
      uVar41 = 0x7fffffff;
      break;
    case 4:
      aVar47 = (anon_struct_4_10_545f55a1_for_swreg9)
               (((uint)pVVar103->swreg9 & 0xfffffffb) + (uVar86 & 1) * 4);
      goto LAB_0021a67d;
    case 5:
      aVar47 = (anon_struct_4_10_545f55a1_for_swreg9)
               (((uint)pVVar103->swreg9 & 0xfffffff7) + (uVar86 & 1) * 8);
LAB_0021a67d:
      pVVar103->swreg9 = aVar47;
      goto LAB_0021a693;
    case 6:
      pVVar103->swreg9 =
           (anon_struct_4_10_545f55a1_for_swreg9)
           ((uint)pVVar103->swreg9 & 0xffffffef | (uVar86 & 1) << 4);
      goto LAB_0021a693;
    }
    pVVar103->swreg59 = (anon_struct_4_8_3e79bdc5_for_swreg59)((uint)aVar79 & uVar41 | uVar86);
LAB_0021a693:
    puVar88 = puVar88 + 0x1b;
    uVar101 = uVar105;
  } while (uVar105 != 7);
  pVVar103->swreg184 =
       (anon_struct_4_5_d5c663f9_for_swreg184)
       ((uint)pVVar103->swreg184 & 0xe7ffffff | (*(byte *)((long)pvVar31 + 0x7a6) & 3) << 0x1b);
  pVVar103->swreg185 =
       (anon_struct_4_5_7e86ff7e_for_swreg185)
       ((uint)pVVar103->swreg185 & 0xe7ffffff | (*(byte *)((long)pvVar31 + 0x812) & 3) << 0x1b);
  pVVar103->swreg186 =
       (anon_struct_4_5_d0d94302_for_swreg186)
       ((uint)pVVar103->swreg186 & 0xe7ffffff | (*(byte *)((long)pvVar31 + 0x87e) & 3) << 0x1b);
  pVVar103->swreg187 =
       (anon_struct_4_5_603a5415_for_swreg187)
       ((uint)pVVar103->swreg187 & 0xe7ffffff | (*(byte *)((long)pvVar31 + 0x8ea) & 3) << 0x1b);
  pVVar103->swreg188 =
       (anon_struct_4_5_bc441407_for_swreg188)
       ((uint)pVVar103->swreg188 & 0xe7ffffff | (*(byte *)((long)pvVar31 + 0x956) & 3) << 0x1b);
  pVVar103->swreg257 =
       (anon_struct_4_5_f90917a6_for_swreg257)
       ((uint)pVVar103->swreg257 & 0xe7ffffff | (*(byte *)((long)pvVar31 + 0x9c2) & 3) << 0x1b);
  pVVar103->swreg262 =
       (anon_struct_4_5_fe228d5b_for_swreg262)
       ((uint)pVVar103->swreg262 & 0xe7ffffff | (*(byte *)((long)pvVar31 + 0xa2e) & 3) << 0x1b);
  if ((*(byte *)((long)pvVar31 + 0x17) & 2) == 0) {
    if (!bVar109) {
      RVar40 = *(RK_S8 *)((long)pvVar31 + 0x7a4);
      goto LAB_0021a795;
    }
  }
  else {
    RVar40 = *(RK_S8 *)((long)pvVar31 + 10);
LAB_0021a795:
    ctx->prev_out_buffer_i = RVar40;
  }
  uVar86 = (uint)*(byte *)((long)pvVar31 + 0x530);
  refs_selected[2] = 0;
  refs_selected[0] = 0;
  refs_selected[1] = 0;
  uVar4 = *(ushort *)((long)pvVar31 + 2);
  uVar5 = *(ushort *)((long)pvVar31 + 4);
  mf_types[2] = '\0';
  mf_types[0] = '\0';
  mf_types[1] = '\0';
  uVar101 = 0;
  uVar105 = 0;
  if (-1 < *(char *)((long)pvVar31 + 0xa2c)) {
    uVar105 = (ulong)*(uint *)((long)pvVar31 + 0xa04);
  }
  if (-1 < *(char *)((long)pvVar31 + 0x8e8)) {
    uVar101 = (ulong)*(uint *)((long)pvVar31 + 0x8c0);
  }
  uVar106 = 0;
  uVar87 = 0;
  if (-1 < *(char *)((long)pvVar31 + 0x954)) {
    uVar87 = (ulong)*(uint *)((long)pvVar31 + 0x92c);
  }
  if (-1 < *(char *)((long)pvVar31 + 0x9c0)) {
    uVar106 = (ulong)*(uint *)((long)pvVar31 + 0x998);
  }
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","frame_offset[%d %d %d %d] lst_idx %d alt_off %d\n",(char *)0x0,
               uVar105,uVar101,uVar87,uVar106,(ulong)(uint)(int)*(char *)((long)pvVar31 + 0x7a4),
               (ulong)*(uint *)((long)pvVar31 + 0x798));
  }
  uVar70 = uVar4 + 7 >> 3;
  uVar41 = uVar5 + 7 >> 3;
  uVar96 = 0;
  if (*(char *)((long)pvVar31 + 0x7a4) < '\0') {
    iVar94 = 2;
    uVar96 = 0;
  }
  else {
    iVar94 = 1;
    if (*(int *)((long)pvVar31 + 0x798) != (int)uVar101) {
      bVar109 = true;
      if (*(int *)((long)pvVar31 + 0x7a0) == 0) {
        bVar109 = *(int *)((long)pvVar31 + 0x79c) != 0;
      }
      if (((*(int *)((long)pvVar31 + 0x774) + 7U >> 3 == uVar70) &&
          (*(int *)((long)pvVar31 + 0x778) + 7U >> 3 == uVar41)) && (uVar96 = 0, !bVar109)) {
        mf_types[0] = '\x01';
        refs_selected._0_8_ = refs_selected._0_8_ & 0xffffffff00000000;
        uVar96 = 1;
      }
    }
  }
  cVar2 = *(char *)((long)pvVar31 + 0x531);
  uVar101 = uVar96;
  if ((cVar2 != '\0') &&
     (uVar93 = (int)uVar87 - uVar86, uVar71 = 1 << (cVar2 - 1U & 0x1f),
     (int)(uVar71 & uVar93) < (int)(uVar71 - 1 & uVar93))) {
    bVar109 = true;
    if (*(int *)((long)pvVar31 + 0x950) == 0) {
      bVar109 = *(int *)((long)pvVar31 + 0x94c) != 0;
    }
    if (((*(int *)((long)pvVar31 + 0x924) + 7U >> 3 == uVar70) &&
        (*(int *)((long)pvVar31 + 0x928) + 7U >> 3 == uVar41)) && (!bVar109)) {
      mf_types[uVar96] = '\x05';
      uVar101 = (ulong)((int)uVar96 + 1);
      refs_selected[uVar96] = 4;
      iVar94 = iVar94 + -1;
    }
  }
  uVar87 = uVar101;
  if ((cVar2 != '\0') &&
     (uVar71 = (int)uVar106 - uVar86, uVar93 = 1 << (cVar2 - 1U & 0x1f),
     (int)(uVar93 & uVar71) < (int)(uVar93 - 1 & uVar71))) {
    bVar109 = true;
    if (*(int *)((long)pvVar31 + 0x9bc) == 0) {
      bVar109 = *(int *)((long)pvVar31 + 0x9b8) != 0;
    }
    if (((*(int *)((long)pvVar31 + 0x990) + 7U >> 3 == uVar70) &&
        (*(int *)((long)pvVar31 + 0x994) + 7U >> 3 == uVar41)) && (!bVar109)) {
      mf_types[uVar101] = '\x06';
      uVar87 = (ulong)((int)uVar101 + 1);
      refs_selected[uVar101] = 5;
      iVar94 = iVar94 + -1;
    }
  }
  if (cVar2 == '\0') {
    bVar109 = false;
  }
  else {
    uVar71 = (int)uVar105 - uVar86;
    uVar93 = 1 << (cVar2 - 1U & 0x1f);
    bVar109 = (int)(uVar93 & uVar71) < (int)(uVar93 - 1 & uVar71);
  }
  uVar101 = uVar87;
  if ((bool)(-1 < iVar94 & bVar109)) {
    bVar109 = true;
    if (*(int *)((long)pvVar31 + 0xa28) == 0) {
      bVar109 = *(int *)((long)pvVar31 + 0xa24) != 0;
    }
    if (((*(int *)((long)pvVar31 + 0x9fc) + 7U >> 3 == uVar70) &&
        (*(int *)((long)pvVar31 + 0xa00) + 7U >> 3 == uVar41)) && (!bVar109)) {
      mf_types[uVar87] = '\a';
      uVar101 = (ulong)((int)uVar87 + 1);
      refs_selected[uVar87] = 6;
      iVar94 = iVar94 + -1;
    }
  }
  uVar93 = (uint)uVar101;
  if ((-1 < iVar94) && (-1 < *(char *)((long)pvVar31 + 0x810))) {
    bVar109 = true;
    if (*(int *)((long)pvVar31 + 0x80c) == 0) {
      bVar109 = *(int *)((long)pvVar31 + 0x808) != 0;
    }
    if (((*(int *)((long)pvVar31 + 0x7e0) + 7U >> 3 == uVar70) &&
        (*(int *)((long)pvVar31 + 0x7e4) + 7U >> 3 == uVar41)) && (!bVar109)) {
      mf_types[uVar101] = '\x02';
      uVar93 = uVar93 + 1;
      refs_selected[uVar101] = 1;
    }
  }
  puVar88 = (uint *)((long)pvVar31 + 0x77c);
  uVar101 = 0;
  do {
    uVar71 = puVar88[10];
    if ((char)uVar71 < 0) {
      cur_offset[uVar101] = 0;
      local_1a58[uVar101] = 0;
    }
    else {
      uVar72 = *puVar88;
      cVar2 = *(char *)((long)pvVar31 + 0x531);
      uVar87 = 0;
      uVar105 = 0;
      if (cVar2 != '\0') {
        uVar73 = 1 << (cVar2 - 1U & 0x1f);
        uVar105 = (ulong)((uVar73 - 1 & uVar86 - uVar72) - (uVar73 & uVar86 - uVar72));
      }
      cur_offset[uVar101] = (RK_S32)uVar105;
      if (cVar2 != '\0') {
        uVar73 = 1 << (cVar2 - 1U & 0x1f);
        uVar87 = (ulong)((uVar73 - 1 & uVar72 - uVar86) - (uVar73 & uVar72 - uVar86));
      }
      local_1a58[uVar101] = (uint)uVar87;
      if (((byte)hal_av1d_debug & 8) != 0) {
        _mpp_log_l(4,"hal_av1d_vdpu","buf_idx[%d]=%d offset[%d : %d] hin %d\n",(char *)0x0,
                   uVar101 & 0xffffffff,(ulong)(uint)(int)(char)uVar71,uVar105,uVar87,(ulong)uVar72)
        ;
      }
    }
    uVar101 = uVar101 + 1;
    puVar88 = puVar88 + 0x1b;
  } while (uVar101 != 7);
  aVar48 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)pVVar103->swreg11 & 0xfffffff0);
  pVVar103->swreg11 = aVar48;
  if ((((*(byte *)((long)pvVar31 + 0x18) & 0x40) != 0) && (uVar93 != 0)) &&
     (cur_offset[(ulong)mf_types[0] - 1] + 0x1fU < 0x3f)) {
    pVVar103->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar48 | 8);
    lVar80 = (long)refs_selected[0];
    iVar94 = *(int *)((long)pvVar31 + lVar80 * 0x6c + 0x77c);
    cVar2 = *(char *)((long)pvVar31 + 0x531);
    uVar71 = 0;
    uVar86 = 0;
    if (cVar2 != '\0') {
      uVar86 = 1 << (cVar2 - 1U & 0x1f);
      uVar86 = ((uVar86 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 3]) -
                (uVar86 & iVar94 - puVar1[lVar80 * 0x1b + 3]) & 0x1ff) << 0x16;
      uVar71 = 1 << (cVar2 - 1U & 0x1f);
      uVar71 = ((uVar71 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 4]) -
                (uVar71 & iVar94 - puVar1[lVar80 * 0x1b + 4]) & 0x1ff) << 0x16;
    }
    uVar73 = 0;
    uVar72 = 0;
    if (cVar2 != '\0') {
      uVar72 = 1 << (cVar2 - 1U & 0x1f);
      uVar72 = ((uVar72 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 5]) -
                (uVar72 & iVar94 - puVar1[lVar80 * 0x1b + 5]) & 0x1ff) << 0x16;
      uVar73 = 1 << (cVar2 - 1U & 0x1f);
      uVar73 = ((uVar73 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 6]) -
                (uVar73 & iVar94 - puVar1[lVar80 * 0x1b + 6]) & 0x1ff) << 0x16;
    }
    uVar75 = 0;
    uVar74 = 0;
    if (cVar2 == '\0') {
      uVar76 = 0;
    }
    else {
      uVar74 = 1 << (cVar2 - 1U & 0x1f);
      uVar74 = ((uVar74 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 7]) -
                (uVar74 & iVar94 - puVar1[lVar80 * 0x1b + 7]) & 0x1ff) << 0x16;
      uVar75 = 1 << (cVar2 - 1U & 0x1f);
      uVar75 = ((uVar75 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 8]) -
                (uVar75 & iVar94 - puVar1[lVar80 * 0x1b + 8]) & 0x1ff) << 0x16;
      uVar76 = 1 << (cVar2 - 1U & 0x1f);
      uVar76 = ((uVar76 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 9]) -
                (uVar76 & iVar94 - puVar1[lVar80 * 0x1b + 9]) & 0x1ff) << 0x16;
    }
    pVVar103->swreg20 =
         (anon_struct_4_6_b76789ed_for_swreg20)((uint)pVVar103->swreg20 & 0x803fffff | uVar86);
    pVVar103->swreg21 =
         (anon_struct_4_6_034ecb4d_for_swreg21)((uint)pVVar103->swreg21 & 0x803fffff | uVar71);
    pVVar103->swreg22 =
         (anon_struct_4_6_6b3e87ec_for_swreg22)((uint)pVVar103->swreg22 & 0x803fffff | uVar72);
    pVVar103->swreg23 =
         (anon_struct_4_6_8162041a_for_swreg23)((uint)pVVar103->swreg23 & 0x803fffff | uVar73);
    pVVar103->swreg24 =
         (anon_struct_4_6_8c43d0ff_for_swreg24)((uint)pVVar103->swreg24 & 0x803fffff | uVar74);
    pVVar103->swreg25 =
         (anon_struct_4_6_1cc34941_for_swreg25)((uint)pVVar103->swreg25 & 0x803fffff | uVar75);
    pVVar103->swreg26 =
         (anon_struct_4_6_9786faf9_for_swreg26)((uint)pVVar103->swreg26 & 0x803fffff | uVar76);
  }
  if ((((*(ulong *)((long)pvVar31 + 0x14) & 0x4000000000) != 0) && (1 < uVar93)) &&
     (cur_offset[(ulong)mf_types[1] - 1] + 0x1fU < 0x3f)) {
    *(byte *)&pVVar103->swreg11 = *(byte *)&pVVar103->swreg11 | 4;
    lVar80 = (long)refs_selected[1];
    iVar94 = *(int *)((long)pvVar31 + lVar80 * 0x6c + 0x77c);
    cVar2 = *(char *)((long)pvVar31 + 0x531);
    uVar71 = 0;
    uVar86 = 0;
    if (cVar2 != '\0') {
      uVar86 = 1 << (cVar2 - 1U & 0x1f);
      uVar86 = ((uVar86 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 3]) -
                (uVar86 & iVar94 - puVar1[lVar80 * 0x1b + 3]) & 0x1ff) << 0x16;
      uVar71 = 1 << (cVar2 - 1U & 0x1f);
      uVar71 = (uVar71 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 4]) -
               (uVar71 & iVar94 - puVar1[lVar80 * 0x1b + 4]) & 0x1ff;
    }
    uVar73 = 0;
    uVar72 = 0;
    if (cVar2 != '\0') {
      uVar72 = 1 << (cVar2 - 1U & 0x1f);
      uVar72 = ((uVar72 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 5]) -
                (uVar72 & iVar94 - puVar1[lVar80 * 0x1b + 5]) & 0x1ff) << 9;
      uVar73 = 1 << (cVar2 - 1U & 0x1f);
      uVar73 = ((uVar73 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 6]) -
                (uVar73 & iVar94 - puVar1[lVar80 * 0x1b + 6]) & 0x1ff) << 0x12;
    }
    uVar75 = 0;
    uVar74 = 0;
    if (cVar2 == '\0') {
      uVar76 = 0;
    }
    else {
      uVar74 = 1 << (cVar2 - 1U & 0x1f);
      uVar74 = (uVar74 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 7]) -
               (uVar74 & iVar94 - puVar1[lVar80 * 0x1b + 7]) & 0x1ff;
      uVar75 = 1 << (cVar2 - 1U & 0x1f);
      uVar75 = ((uVar75 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 8]) -
                (uVar75 & iVar94 - puVar1[lVar80 * 0x1b + 8]) & 0x1ff) << 9;
      uVar76 = 1 << (cVar2 - 1U & 0x1f);
      uVar76 = ((uVar76 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 9]) -
                (uVar76 & iVar94 - puVar1[lVar80 * 0x1b + 9]) & 0x1ff) << 0x12;
    }
    pVVar103->swreg27 =
         (anon_struct_4_6_a6507eae_for_swreg27)((uint)pVVar103->swreg27 & 0x803fffff | uVar86);
    pVVar103->swreg47 =
         (anon_struct_4_5_8bdbaba8_for_swreg47)
         (uVar72 | uVar71 | uVar73 | (uint)pVVar103->swreg47 & 0xf8000000);
    pVVar103->swreg48 =
         (anon_struct_4_5_5cd422b8_for_swreg48)
         (uVar75 | uVar74 | uVar76 | (uint)pVVar103->swreg48 & 0xf8000000);
  }
  if ((((*(ulong *)((long)pvVar31 + 0x14) & 0x4000000000) != 0) && (2 < uVar93)) &&
     (cur_offset[(ulong)mf_types[2] - 1] + 0x1fU < 0x3f)) {
    *(byte *)&pVVar103->swreg11 = *(byte *)&pVVar103->swreg11 | 2;
    lVar80 = (long)refs_selected[2];
    iVar94 = *(int *)((long)pvVar31 + lVar80 * 0x6c + 0x77c);
    cVar2 = *(char *)((long)pvVar31 + 0x531);
    uVar93 = 0;
    uVar86 = 0;
    if (cVar2 != '\0') {
      uVar86 = 1 << (cVar2 - 1U & 0x1f);
      uVar86 = ((uVar86 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 3]) -
                (uVar86 & iVar94 - puVar1[lVar80 * 0x1b + 3]) & 0x1ff) << 0x12;
      uVar93 = 1 << (cVar2 - 1U & 0x1f);
      uVar93 = ((uVar93 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 4]) -
                (uVar93 & iVar94 - puVar1[lVar80 * 0x1b + 4]) & 0x1ff) << 0x12;
    }
    uVar72 = 0;
    uVar71 = 0;
    if (cVar2 != '\0') {
      uVar71 = 1 << (cVar2 - 1U & 0x1f);
      uVar71 = ((uVar71 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 5]) -
                (uVar71 & iVar94 - puVar1[lVar80 * 0x1b + 5]) & 0x1ff) << 0x12;
      uVar72 = 1 << (cVar2 - 1U & 0x1f);
      uVar72 = ((uVar72 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 6]) -
                (uVar72 & iVar94 - puVar1[lVar80 * 0x1b + 6]) & 0x1ff) << 0x12;
    }
    uVar74 = 0;
    uVar73 = 0;
    if (cVar2 == '\0') {
      uVar75 = 0;
    }
    else {
      uVar73 = 1 << (cVar2 - 1U & 0x1f);
      uVar73 = ((uVar73 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 7]) -
                (uVar73 & iVar94 - puVar1[lVar80 * 0x1b + 7]) & 0x1ff) << 0x12;
      uVar74 = 1 << (cVar2 - 1U & 0x1f);
      uVar74 = ((uVar74 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 8]) -
                (uVar74 & iVar94 - puVar1[lVar80 * 0x1b + 8]) & 0x1ff) << 0x12;
      uVar75 = 1 << (cVar2 - 1U & 0x1f);
      uVar75 = ((uVar75 - 1 & iVar94 - puVar1[lVar80 * 0x1b + 9]) -
                (uVar75 & iVar94 - puVar1[lVar80 * 0x1b + 9]) & 0x1ff) << 0x12;
    }
    pVVar103->swreg184 =
         (anon_struct_4_5_d5c663f9_for_swreg184)((uint)pVVar103->swreg184 & 0xf803ffff | uVar86);
    pVVar103->swreg185 =
         (anon_struct_4_5_7e86ff7e_for_swreg185)((uint)pVVar103->swreg185 & 0xf803ffff | uVar93);
    pVVar103->swreg186 =
         (anon_struct_4_5_d0d94302_for_swreg186)((uint)pVVar103->swreg186 & 0xf803ffff | uVar71);
    pVVar103->swreg187 =
         (anon_struct_4_5_603a5415_for_swreg187)((uint)pVVar103->swreg187 & 0xf803ffff | uVar72);
    pVVar103->swreg188 =
         (anon_struct_4_5_bc441407_for_swreg188)((uint)pVVar103->swreg188 & 0xf803ffff | uVar73);
    pVVar103->swreg257 =
         (anon_struct_4_5_f90917a6_for_swreg257)((uint)pVVar103->swreg257 & 0xf803ffff | uVar74);
    pVVar103->swreg262 =
         (anon_struct_4_5_fe228d5b_for_swreg262)((uint)pVVar103->swreg262 & 0xf803ffff | uVar75);
  }
  if (((*(char *)((long)pvVar31 + 0x57c) != '\0') && ((ulong)*(byte *)((long)pvVar31 + 0x52e) < 7))
     && (cVar2 = *(char *)((long)pvVar31 + (ulong)*(byte *)((long)pvVar31 + 0x52e) * 0x6c + 0x7a4),
        -1 < cVar2)) {
    uVar86 = ctx->luma_size;
    pHVar66 = hal_bufs_get_buf(ctx->tile_out_bufs,(int)cVar2);
    (pVVar103->addr_cfg).swreg80 = (anon_struct_4_1_24a8dd6e_for_swreg80)0x0;
    aVar49 = (anon_struct_4_1_24a8d9ad_for_swreg81)
             mpp_buffer_get_fd_with_caller(*pHVar66->buf,"vdpu_av1d_set_reference_frames");
    (pVVar103->addr_cfg).swreg81 = aVar49;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x51,uVar86 + (uVar86 >> 1) + 0x40);
    *(byte *)&pVVar103->swreg11 = *(byte *)&pVVar103->swreg11 | 1;
  }
  uVar101 = (ulong)*(byte *)((long)pvVar31 + 0x52e);
  if (uVar101 < 7) {
    bVar109 = true;
    if (uVar70 == puVar1[uVar101 * 0x1b] + 7 >> 3) {
      bVar109 = uVar41 != puVar1[uVar101 * 0x1b + 1] + 7 >> 3;
    }
    ctx->resolution_change = bVar109;
  }
  uVar86 = (cur_offset[0] & 0x1ffU) << 9;
  aVar8 = pVVar103->swreg184;
  pVVar103->swreg184 = (anon_struct_4_5_d5c663f9_for_swreg184)((uint)aVar8 & 0xfffc01ff | uVar86);
  uVar41 = (cur_offset[1] & 0x1ffU) << 9;
  aVar9 = pVVar103->swreg185;
  pVVar103->swreg185 = (anon_struct_4_5_7e86ff7e_for_swreg185)((uint)aVar9 & 0xfffc01ff | uVar41);
  uVar70 = (cur_offset[2] & 0x1ffU) << 9;
  aVar10 = pVVar103->swreg186;
  pVVar103->swreg186 = (anon_struct_4_5_d0d94302_for_swreg186)((uint)aVar10 & 0xfffc01ff | uVar70);
  uVar93 = (cur_offset[3] & 0x1ffU) << 9;
  aVar11 = pVVar103->swreg187;
  pVVar103->swreg187 = (anon_struct_4_5_603a5415_for_swreg187)((uint)aVar11 & 0xfffc01ff | uVar93);
  uVar71 = (cur_offset[4] & 0x1ffU) << 9;
  aVar12 = pVVar103->swreg188;
  pVVar103->swreg188 = (anon_struct_4_5_bc441407_for_swreg188)((uint)aVar12 & 0xfffc01ff | uVar71);
  uVar72 = (cur_offset[5] & 0x1ffU) << 9;
  aVar13 = pVVar103->swreg257;
  pVVar103->swreg257 = (anon_struct_4_5_f90917a6_for_swreg257)((uint)aVar13 & 0xfffc01ff | uVar72);
  uVar73 = (cur_offset[6] & 0x1ffU) << 9;
  aVar14 = pVVar103->swreg262;
  pVVar103->swreg262 = (anon_struct_4_5_fe228d5b_for_swreg262)((uint)aVar14 & 0xfffc01ff | uVar73);
  pVVar103->swreg184 =
       (anon_struct_4_5_d5c663f9_for_swreg184)
       ((uint)aVar8 & 0xfffc0000 | uVar86 | local_1a58[0] & 0x1ff);
  pVVar103->swreg185 =
       (anon_struct_4_5_7e86ff7e_for_swreg185)
       ((uint)aVar9 & 0xfffc0000 | uVar41 | local_1a58[1] & 0x1ff);
  pVVar103->swreg186 =
       (anon_struct_4_5_d0d94302_for_swreg186)
       ((uint)aVar10 & 0xfffc0000 | uVar70 | local_1a58[2] & 0x1ff);
  pVVar103->swreg187 =
       (anon_struct_4_5_603a5415_for_swreg187)
       ((uint)aVar11 & 0xfffc0000 | uVar93 | local_1a58[3] & 0x1ff);
  pVVar103->swreg188 =
       (anon_struct_4_5_bc441407_for_swreg188)
       ((uint)aVar12 & 0xfffc0000 | uVar71 | local_1a58[4] & 0x1ff);
  pVVar103->swreg257 =
       (anon_struct_4_5_f90917a6_for_swreg257)
       ((uint)aVar13 & 0xfffc0000 | uVar72 | local_1a58[5] & 0x1ff);
  pVVar103->swreg262 =
       (anon_struct_4_5_fe228d5b_for_swreg262)
       ((uint)aVar14 & 0xfffc0000 | uVar73 | local_1a58[6] & 0x1ff);
  aVar47 = pVVar103->swreg9;
  uVar86 = (uint)(byte)(mf_types[0] * ' ' - 0x20);
  pVVar103->swreg9 = (anon_struct_4_10_545f55a1_for_swreg9)((uint)aVar47 & 0xffffff1f | uVar86);
  uVar41 = (uint)(mf_types[1] - 1 & 7) << 8;
  pVVar103->swreg9 =
       (anon_struct_4_10_545f55a1_for_swreg9)((uint)aVar47 & 0xfffff81f | uVar86 | uVar41);
  pVVar103->swreg9 =
       (anon_struct_4_10_545f55a1_for_swreg9)
       ((uint)aVar47 & 0xffffc01f | uVar86 | uVar41 | (uint)(mf_types[2] - 1 & 7) << 0xb);
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","mf_types[%d %d %d]\n",(char *)0x0,(ulong)mf_types[0],
               (ulong)mf_types[1],(ulong)mf_types[2]);
  }
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)((uint)pVVar103->swreg5 & 0xfffffffe | local_93d8);
LAB_0021b5a3:
  pVVar103 = ctx->regs;
  aVar27 = (anon_struct_4_10_0fd9c99d_for_swreg13)
           (((uint)pVVar103->swreg13 & 0xfffffffb) + (*(byte *)((long)pvVar31 + 0x57f) & 1) * 4);
  pVVar103->swreg13 = aVar27;
  aVar27 = (anon_struct_4_10_0fd9c99d_for_swreg13)
           (((uint)aVar27 & 0xfffffffd) + (*(byte *)((long)pvVar31 + 0x57d) & 1) * 2);
  pVVar103->swreg13 = aVar27;
  pVVar103->swreg13 =
       (anon_struct_4_10_0fd9c99d_for_swreg13)
       ((uint)aVar27 & 0xfffffffe | *(byte *)((long)pvVar31 + 0x57c) & 1);
  uVar86 = (uint)((ulong)*(undefined8 *)((long)pvVar31 + 0x14) >> 0x27) & 4;
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)((uint)pVVar103->swreg5 & 0xfffffffb | uVar86);
  if (((*(byte *)((long)pvVar31 + 0x528) & 0xfd) == 0) || (uVar86 != 0)) {
    *(byte *)&pVVar103->swreg11 = *(byte *)&pVVar103->swreg11 & 0xfe;
  }
  pVVar103->swreg14 =
       (anon_struct_4_6_2b336929_for_swreg14)
       ((uint)pVVar103->swreg14 & 0x3ffffff | (uint)*(byte *)((long)pvVar31 + 0x532) << 0x1a);
  pVVar103->swreg15 =
       (anon_struct_4_6_2cf6d189_for_swreg15)
       ((uint)pVVar103->swreg15 & 0x3ffffff | (uint)*(byte *)((long)pvVar31 + 0x533) << 0x1a);
  pVVar103->swreg16 =
       (anon_struct_4_6_2eba39e9_for_swreg16)
       ((uint)pVVar103->swreg16 & 0x3ffffff | (uint)*(byte *)((long)pvVar31 + 0x534) << 0x1a);
  pVVar103->swreg17 =
       (anon_struct_4_6_307da249_for_swreg17)
       ((uint)pVVar103->swreg17 & 0x3ffffff | (uint)*(byte *)((long)pvVar31 + 0x535) << 0x1a);
  uVar86 = 0;
  memset(ref_count,0,0x100);
  if (*(char *)((long)pvVar31 + 0x57c) != '\0') {
    cVar2 = *(char *)((long)pvVar31 + 0x528);
    lVar81 = 0;
    lVar80 = 0;
    bVar89 = 0;
    do {
      bVar90 = *(byte *)((long)pvVar31 + lVar80 + 0x580);
      if ((bVar90 & 1) != 0) {
        uVar86 = *(uint *)((long)pvVar31 + lVar81 + 0x588);
        uVar41 = -uVar86;
        if (0 < (int)uVar86) {
          uVar41 = uVar86;
        }
        if (0xfe < uVar41) {
          uVar41 = 0xff;
        }
        *(uint *)((long)ref_count + lVar81) = uVar41;
        bVar89 = bVar89 | (byte)((uVar86 >> 0x1f) << ((byte)lVar80 & 0x1f));
      }
      if ((bVar90 & 2) != 0) {
        iVar94 = *(int *)((long)pvVar31 + lVar81 + 0x58c);
        if (0x3e < iVar94) {
          iVar94 = 0x3f;
        }
        if (iVar94 < -0x3e) {
          iVar94 = -0x3f;
        }
        *(int *)((long)ref_count + lVar81 + 4) = iVar94;
      }
      if ((bVar90 & 4) != 0) {
        iVar94 = *(int *)((long)pvVar31 + lVar81 + 0x590);
        if (0x3e < iVar94) {
          iVar94 = 0x3f;
        }
        if (iVar94 < -0x3e) {
          iVar94 = -0x3f;
        }
        *(int *)((long)ref_count + lVar81 + 8) = iVar94;
      }
      if ((bVar90 & 8) != 0) {
        iVar94 = *(int *)((long)pvVar31 + lVar81 + 0x594);
        if (0x3e < iVar94) {
          iVar94 = 0x3f;
        }
        if (iVar94 < -0x3e) {
          iVar94 = -0x3f;
        }
        *(int *)((long)ref_count + lVar81 + 0xc) = iVar94;
      }
      if ((bVar90 & 0x10) != 0) {
        iVar94 = *(int *)((long)pvVar31 + lVar81 + 0x598);
        if (0x3e < iVar94) {
          iVar94 = 0x3f;
        }
        if (iVar94 < -0x3e) {
          iVar94 = -0x3f;
        }
        *(int *)((long)ref_count + lVar81 + 0x10) = iVar94;
      }
      if ((cVar2 != '\0') && ((bVar90 & 0x20) != 0)) {
        *(int *)((long)ref_count + lVar81 + 0x14) = *(int *)((long)pvVar31 + lVar81 + 0x59c) + 1;
      }
      if ((bVar90 & 0x40) != 0) {
        *(undefined4 *)((long)ref_count + lVar81 + 0x18) = 1;
      }
      if ((char)bVar90 < '\0') {
        *(undefined4 *)((long)ref_count + lVar81 + 0x1c) = 1;
      }
      lVar80 = lVar80 + 1;
      lVar81 = lVar81 + 0x20;
    } while (lVar80 != 8);
    uVar86 = (uint)bVar89 << 2;
  }
  uVar105 = 0;
  uVar101 = 0;
  bVar89 = 0;
  bVar90 = 0;
  do {
    uVar41 = 0;
    do {
      if ((*(byte *)((long)pvVar31 + uVar105 + 0x580) >> (uVar41 & 0x1f) & 1) != 0) {
        bVar90 = bVar90 | 4 < uVar41;
        bVar89 = (byte)uVar101;
        if ((byte)uVar101 < (byte)uVar105) {
          uVar101 = uVar105 & 0xff;
          bVar89 = (byte)uVar105;
        }
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 != 8);
    uVar105 = uVar105 + 1;
  } while (uVar105 != 8);
  pVVar103->swreg9 =
       (anon_struct_4_10_545f55a1_for_swreg9)
       ((uint)pVVar103->swreg9 & 0xfff1ffff | (uint)(bVar89 & 7) << 0x11);
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)pVVar103->swreg5 & 0xffefffff | (uint)bVar90 << 0x14);
  pVVar103->swreg12 =
       (anon_struct_4_8_66c0642b_for_swreg12)((uint)pVVar103->swreg12 & 0xfffffc03 | uVar86);
  aVar15 = pVVar103->swreg20;
  aVar32._1_3_ = SUB43(pVVar103->swreg14,1);
  aVar32._0_1_ = (undefined1)ref_count[0];
  pVVar103->swreg14 = aVar32;
  uVar86 = (ref_count[1] & 0x7fU) << 0x13;
  pVVar103->swreg14 = (anon_struct_4_6_2b336929_for_swreg14)((uint)aVar32 & 0xfc07ffff | uVar86);
  uVar41 = ref_count[2] & 0x7f;
  pVVar103->swreg20 = (anon_struct_4_6_b76789ed_for_swreg20)((uint)aVar15 & 0xffffff80 | uVar41);
  uVar70 = (ref_count[3] & 0x7fU) << 7;
  pVVar103->swreg20 =
       (anon_struct_4_6_b76789ed_for_swreg20)((uint)aVar15 & 0xffffc000 | uVar41 | uVar70);
  uVar93 = (ref_count[4] & 0x7fU) << 0xe;
  pVVar103->swreg20 =
       (anon_struct_4_6_b76789ed_for_swreg20)((uint)aVar15 & 0xffe00000 | uVar41 | uVar70 | uVar93);
  uVar71 = (ref_count[5] & 0xfU) << 0xf;
  pVVar103->swreg14 =
       (anon_struct_4_6_2b336929_for_swreg14)((uint)aVar32 & 0xfc007fff | uVar86 | uVar71);
  pVVar103->swreg14 =
       (anon_struct_4_6_2b336929_for_swreg14)
       ((uint)aVar32 & 0xfc003fff | uVar86 | uVar71 | (ref_count[6] & 1U) << 0xe);
  pVVar103->swreg20 =
       (anon_struct_4_6_b76789ed_for_swreg20)
       ((uint)aVar15 & 0xffc00000 | uVar41 | uVar70 | uVar93 | (ref_count[7] & 1U) << 0x15);
  aVar33._1_3_ = SUB43(pVVar103->swreg15,1);
  aVar33._0_1_ = (undefined1)ref_count[8];
  pVVar103->swreg15 = aVar33;
  uVar86 = (ref_count[9] & 0x7fU) << 0x13;
  pVVar103->swreg15 = (anon_struct_4_6_2cf6d189_for_swreg15)((uint)aVar33 & 0xfc07ffff | uVar86);
  aVar16 = pVVar103->swreg21;
  uVar41 = ref_count[10] & 0x7f;
  pVVar103->swreg21 = (anon_struct_4_6_034ecb4d_for_swreg21)((uint)aVar16 & 0xffffff80 | uVar41);
  uVar70 = (ref_count[0xb] & 0x7fU) << 7;
  pVVar103->swreg21 =
       (anon_struct_4_6_034ecb4d_for_swreg21)((uint)aVar16 & 0xffffc000 | uVar41 | uVar70);
  uVar93 = (ref_count[0xc] & 0x7fU) << 0xe;
  pVVar103->swreg21 =
       (anon_struct_4_6_034ecb4d_for_swreg21)((uint)aVar16 & 0xffe00000 | uVar41 | uVar70 | uVar93);
  uVar71 = (ref_count[0xd] & 0xfU) << 0xf;
  pVVar103->swreg15 =
       (anon_struct_4_6_2cf6d189_for_swreg15)((uint)aVar33 & 0xfc007fff | uVar86 | uVar71);
  pVVar103->swreg15 =
       (anon_struct_4_6_2cf6d189_for_swreg15)
       ((uint)aVar33 & 0xfc003fff | uVar86 | uVar71 | (ref_count[0xe] & 1U) << 0xe);
  pVVar103->swreg21 =
       (anon_struct_4_6_034ecb4d_for_swreg21)
       ((uint)aVar16 & 0xffc00000 | uVar41 | uVar70 | uVar93 | (ref_count[0xf] & 1U) << 0x15);
  aVar34._1_3_ = SUB43(pVVar103->swreg16,1);
  aVar34._0_1_ = (undefined1)ref_count[0x10];
  pVVar103->swreg16 = aVar34;
  uVar86 = (ref_count[0x11] & 0x7fU) << 0x13;
  pVVar103->swreg16 = (anon_struct_4_6_2eba39e9_for_swreg16)((uint)aVar34 & 0xfc07ffff | uVar86);
  aVar17 = pVVar103->swreg22;
  uVar41 = ref_count[0x12] & 0x7f;
  pVVar103->swreg22 = (anon_struct_4_6_6b3e87ec_for_swreg22)((uint)aVar17 & 0xffffff80 | uVar41);
  uVar70 = (ref_count[0x13] & 0x7fU) << 7;
  pVVar103->swreg22 =
       (anon_struct_4_6_6b3e87ec_for_swreg22)((uint)aVar17 & 0xffffc000 | uVar41 | uVar70);
  uVar93 = (ref_count[0x14] & 0x7fU) << 0xe;
  pVVar103->swreg22 =
       (anon_struct_4_6_6b3e87ec_for_swreg22)((uint)aVar17 & 0xffe00000 | uVar41 | uVar70 | uVar93);
  uVar71 = (ref_count[0x15] & 0xfU) << 0xf;
  pVVar103->swreg16 =
       (anon_struct_4_6_2eba39e9_for_swreg16)((uint)aVar34 & 0xfc007fff | uVar86 | uVar71);
  pVVar103->swreg16 =
       (anon_struct_4_6_2eba39e9_for_swreg16)
       ((uint)aVar34 & 0xfc003fff | uVar86 | uVar71 | (ref_count[0x16] & 1U) << 0xe);
  pVVar103->swreg22 =
       (anon_struct_4_6_6b3e87ec_for_swreg22)
       ((uint)aVar17 & 0xffc00000 | uVar41 | uVar70 | uVar93 | (ref_count[0x17] & 1U) << 0x15);
  aVar35._1_3_ = SUB43(pVVar103->swreg17,1);
  aVar35._0_1_ = local_91a8;
  pVVar103->swreg17 = aVar35;
  uVar86 = (local_91a4 & 0x7f) << 0x13;
  pVVar103->swreg17 = (anon_struct_4_6_307da249_for_swreg17)((uint)aVar35 & 0xfc07ffff | uVar86);
  aVar18 = pVVar103->swreg23;
  uVar41 = local_91a0 & 0x7f;
  pVVar103->swreg23 = (anon_struct_4_6_8162041a_for_swreg23)((uint)aVar18 & 0xffffff80 | uVar41);
  uVar70 = (local_919c & 0x7f) << 7;
  pVVar103->swreg23 =
       (anon_struct_4_6_8162041a_for_swreg23)((uint)aVar18 & 0xffffc000 | uVar41 | uVar70);
  uVar93 = (local_9198 & 0x7f) << 0xe;
  pVVar103->swreg23 =
       (anon_struct_4_6_8162041a_for_swreg23)((uint)aVar18 & 0xffe00000 | uVar41 | uVar70 | uVar93);
  uVar71 = (local_9194 & 0xf) << 0xf;
  pVVar103->swreg17 =
       (anon_struct_4_6_307da249_for_swreg17)((uint)aVar35 & 0xfc007fff | uVar86 | uVar71);
  pVVar103->swreg17 =
       (anon_struct_4_6_307da249_for_swreg17)
       ((uint)aVar35 & 0xfc003fff | uVar86 | uVar71 | (local_9190 & 1) << 0xe);
  pVVar103->swreg23 =
       (anon_struct_4_6_8162041a_for_swreg23)
       ((uint)aVar18 & 0xffc00000 | uVar41 | uVar70 | uVar93 | (local_918c & 1) << 0x15);
  aVar36._1_3_ = SUB43(pVVar103->swreg18,1);
  aVar36._0_1_ = local_9188;
  pVVar103->swreg18 = aVar36;
  uVar86 = (local_9184 & 0x7f) << 0x13;
  pVVar103->swreg18 = (anon_struct_4_6_a90b2738_for_swreg18)((uint)aVar36 & 0xfc07ffff | uVar86);
  aVar19 = pVVar103->swreg24;
  uVar41 = local_9180 & 0x7f;
  pVVar103->swreg24 = (anon_struct_4_6_8c43d0ff_for_swreg24)((uint)aVar19 & 0xffffff80 | uVar41);
  uVar70 = (local_917c & 0x7f) << 7;
  pVVar103->swreg24 =
       (anon_struct_4_6_8c43d0ff_for_swreg24)((uint)aVar19 & 0xffffc000 | uVar41 | uVar70);
  uVar93 = (local_9178 & 0x7f) << 0xe;
  pVVar103->swreg24 =
       (anon_struct_4_6_8c43d0ff_for_swreg24)((uint)aVar19 & 0xffe00000 | uVar41 | uVar70 | uVar93);
  uVar71 = (local_9174 & 0xf) << 0xf;
  pVVar103->swreg18 =
       (anon_struct_4_6_a90b2738_for_swreg18)((uint)aVar36 & 0xfc007fff | uVar86 | uVar71);
  pVVar103->swreg18 =
       (anon_struct_4_6_a90b2738_for_swreg18)
       ((uint)aVar36 & 0xfc003fff | uVar86 | uVar71 | (local_9170 & 1) << 0xe);
  pVVar103->swreg24 =
       (anon_struct_4_6_8c43d0ff_for_swreg24)
       ((uint)aVar19 & 0xffc00000 | uVar41 | uVar70 | uVar93 | (local_916c & 1) << 0x15);
  aVar37._1_3_ = SUB43(pVVar103->swreg19,1);
  aVar37._0_1_ = local_9168;
  pVVar103->swreg19 = aVar37;
  uVar86 = (local_9164 & 0x7f) << 0x13;
  pVVar103->swreg19 = (anon_struct_4_6_fc300d31_for_swreg19)((uint)aVar37 & 0xfc07ffff | uVar86);
  aVar20 = pVVar103->swreg25;
  uVar41 = local_9160 & 0x7f;
  pVVar103->swreg25 = (anon_struct_4_6_1cc34941_for_swreg25)((uint)aVar20 & 0xffffff80 | uVar41);
  uVar70 = (local_915c & 0x7f) << 7;
  pVVar103->swreg25 =
       (anon_struct_4_6_1cc34941_for_swreg25)((uint)aVar20 & 0xffffc000 | uVar41 | uVar70);
  uVar93 = (local_9158 & 0x7f) << 0xe;
  pVVar103->swreg25 =
       (anon_struct_4_6_1cc34941_for_swreg25)((uint)aVar20 & 0xffe00000 | uVar41 | uVar70 | uVar93);
  uVar71 = (local_9154 & 0xf) << 0xf;
  pVVar103->swreg19 =
       (anon_struct_4_6_fc300d31_for_swreg19)((uint)aVar37 & 0xfc007fff | uVar86 | uVar71);
  pVVar103->swreg19 =
       (anon_struct_4_6_fc300d31_for_swreg19)
       ((uint)aVar37 & 0xfc003fff | uVar86 | uVar71 | (local_9150 & 1) << 0xe);
  pVVar103->swreg25 =
       (anon_struct_4_6_1cc34941_for_swreg25)
       ((uint)aVar20 & 0xffc00000 | uVar41 | uVar70 | uVar93 | (local_914c & 1) << 0x15);
  aVar28._1_3_ = SUB43(pVVar103->swreg31,1);
  aVar28._0_1_ = local_9148;
  pVVar103->swreg31 = aVar28;
  uVar86 = (local_9144 & 0x7f) << 0x13;
  pVVar103->swreg31 = (anon_struct_4_7_653512df_for_swreg31)((uint)aVar28 & 0xfc07ffff | uVar86);
  aVar21 = pVVar103->swreg26;
  uVar41 = local_9140 & 0x7f;
  pVVar103->swreg26 = (anon_struct_4_6_9786faf9_for_swreg26)((uint)aVar21 & 0xffffff80 | uVar41);
  uVar70 = (local_913c & 0x7f) << 7;
  pVVar103->swreg26 =
       (anon_struct_4_6_9786faf9_for_swreg26)((uint)aVar21 & 0xffffc000 | uVar41 | uVar70);
  uVar93 = (local_9138 & 0x7f) << 0xe;
  pVVar103->swreg26 =
       (anon_struct_4_6_9786faf9_for_swreg26)((uint)aVar21 & 0xffe00000 | uVar41 | uVar70 | uVar93);
  uVar71 = (local_9134 & 0xf) << 0xf;
  pVVar103->swreg31 =
       (anon_struct_4_7_653512df_for_swreg31)((uint)aVar28 & 0xfc007fff | uVar86 | uVar71);
  pVVar103->swreg31 =
       (anon_struct_4_7_653512df_for_swreg31)
       ((uint)aVar28 & 0xfc003fff | uVar86 | uVar71 | (local_9130 & 1) << 0xe);
  pVVar103->swreg26 =
       (anon_struct_4_6_9786faf9_for_swreg26)
       ((uint)aVar21 & 0xffc00000 | uVar41 | uVar70 | uVar93 | (local_912c & 1) << 0x15);
  aVar29._1_3_ = SUB43(pVVar103->swreg32,1);
  aVar29._0_1_ = local_9128;
  pVVar103->swreg32 = aVar29;
  uVar70 = (local_9124 & 0x7f) << 0x13;
  pVVar103->swreg32 = (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar29 & 0xfc07ffff | uVar70);
  aVar22 = pVVar103->swreg27;
  uVar93 = local_9120 & 0x7f;
  pVVar103->swreg27 = (anon_struct_4_6_a6507eae_for_swreg27)((uint)aVar22 & 0xffffff80 | uVar93);
  uVar71 = (local_911c & 0x7f) << 7;
  pVVar103->swreg27 =
       (anon_struct_4_6_a6507eae_for_swreg27)((uint)aVar22 & 0xffffc000 | uVar93 | uVar71);
  uVar86 = (local_9118 & 0x7f) << 0xe;
  pVVar103->swreg27 =
       (anon_struct_4_6_a6507eae_for_swreg27)((uint)aVar22 & 0xffe00000 | uVar93 | uVar71 | uVar86);
  uVar41 = (local_9114 & 0xf) << 0xf;
  pVVar103->swreg32 =
       (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar29 & 0xfc007fff | uVar70 | uVar41);
  pVVar103->swreg32 =
       (anon_struct_4_7_66f87b3f_for_swreg32)
       ((uint)aVar29 & 0xfc003fff | uVar70 | uVar41 | (local_9110 & 1) << 0xe);
  pVVar103->swreg27 =
       (anon_struct_4_6_a6507eae_for_swreg27)
       ((uint)aVar22 & 0xffc00000 | uVar93 | uVar71 | uVar86 | (local_910c & 1) << 0x15);
  lVar80 = *(long *)((long)hal + 0x50);
  lVar81 = *(long *)(lVar80 + 0x1e7a8);
  uVar86 = 0;
  if (*(char *)((long)pvVar31 + 0x532) == '\0') {
    uVar86 = (uint)(*(char *)((long)pvVar31 + 0x533) == '\0') << 0xe;
  }
  *(uint *)(lVar81 + 0xc) = *(uint *)(lVar81 + 0xc) & 0xffffbfff | uVar86;
  *(uint *)(lVar81 + 0x14) =
       (*(uint *)(lVar81 + 0x14) & 0xfffffffd) + (uint)(0x20 < *(byte *)((long)pvVar31 + 0x532)) * 2
  ;
  uVar41 = (*(byte *)((long)pvVar31 + 0x536) & 7) << 0x1c;
  uVar86 = *(uint *)(lVar81 + 0x78);
  *(uint *)(lVar81 + 0x78) = uVar86 & 0x8fffffff | uVar41;
  if (*(char *)((long)pvVar31 + 0x537) == '\0') {
    *(uint *)(lVar81 + 0xec) = *(uint *)(lVar81 + 0xec) & 0xf0000000;
    *(uint *)(lVar81 + 0x78) = uVar86 & 0x8fffc000 | uVar41;
    *(uint *)(lVar81 + 0xc4) = *(uint *)(lVar81 + 0xc4) & 0xffffc000;
    uVar41 = uVar86 & 0x80000000 | uVar41;
  }
  else {
    uVar93 = (*(byte *)((long)pvVar31 + 0x53c) & 0x7f) << 0x15;
    uVar70 = *(uint *)(lVar81 + 0xec);
    *(uint *)(lVar81 + 0xec) = uVar70 & 0xf01fffff | uVar93;
    uVar71 = (*(byte *)((long)pvVar31 + 0x53d) & 0x7f) << 0xe;
    *(uint *)(lVar81 + 0xec) = uVar70 & 0xf0003fff | uVar93 | uVar71;
    uVar72 = (*(byte *)((long)pvVar31 + 0x53e) & 0x7f) << 7;
    *(uint *)(lVar81 + 0xec) = uVar70 & 0xf000007f | uVar93 | uVar71 | uVar72;
    *(uint *)(lVar81 + 0xec) =
         uVar70 & 0xf0000000 | uVar93 | uVar71 | uVar72 | *(byte *)((long)pvVar31 + 0x53f) & 0x7f;
    uVar93 = (*(byte *)((long)pvVar31 + 0x540) & 0x7f) << 7;
    *(uint *)(lVar81 + 0x78) = uVar86 & 0x8fffc07f | uVar41 | uVar93;
    uVar71 = *(byte *)((long)pvVar31 + 0x541) & 0x7f;
    *(uint *)(lVar81 + 0x78) = uVar86 & 0x8fffc000 | uVar41 | uVar93 | uVar71;
    uVar72 = (*(byte *)((long)pvVar31 + 0x542) & 0x7f) << 7;
    uVar70 = *(uint *)(lVar81 + 0xc4);
    *(uint *)(lVar81 + 0xc4) = uVar70 & 0xffffc07f | uVar72;
    *(uint *)(lVar81 + 0xc4) =
         uVar70 & 0xffffc000 | uVar72 | *(byte *)((long)pvVar31 + 0x543) & 0x7f;
    uVar70 = (*(byte *)((long)pvVar31 + 0x544) & 0x7f) << 0x15;
    *(uint *)(lVar81 + 0x78) = uVar86 & 0x801fc000 | uVar41 | uVar93 | uVar71 | uVar70;
    uVar41 = uVar86 & 0x80000000 | uVar41 | uVar93 | uVar71 | uVar70 |
             (*(byte *)((long)pvVar31 + 0x545) & 0x7f) << 0xe;
  }
  *(uint *)(lVar81 + 0x78) = uVar41;
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x58),"vdpu_av1d_set_loopfilter");
  *(int *)(lVar81 + 0x2cc) = iVar94;
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x58),"vdpu_av1d_set_loopfilter");
  *(int *)(lVar81 + 0x2dc) = iVar94;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0xb7,*(RK_U32 *)(lVar80 + 0x74));
  lVar80 = *(long *)(*(long *)((long)hal + 0x50) + 0x1e7a8);
  uVar41 = (uint)*(ushort *)((long)pvVar31 + 2) * 0x10000 + 0x70000 & 0xfff80000;
  uVar86 = *(uint *)(lVar80 + 0x10);
  *(uint *)(lVar80 + 0x10) = uVar86 & 0x7ffff | uVar41;
  *(uint *)(lVar80 + 0x10) =
       uVar86 & 0x3f | uVar41 | *(int *)((long)pvVar31 + 4) * 8 + 0x38U & 0x7ffc0;
  uVar70 = 0;
  uVar41 = (uint)(ushort)-*(short *)((long)pvVar31 + 2) << 0x1d;
  uVar86 = *(uint *)(lVar80 + 0x30);
  *(uint *)(lVar80 + 0x30) = uVar86 & 0x1fffffff | uVar41;
  *(uint *)(lVar80 + 0x30) =
       uVar86 & 0x3ffffff | uVar41 | ((ushort)-*(short *)((long)pvVar31 + 4) & 7) << 0x1a;
  *(uint *)(lVar80 + 0x20) =
       *(uint *)(lVar80 + 0x20) & 0x1ffff | *(int *)((long)pvVar31 + 0xc70) << 0x11;
  *(uint *)(lVar80 + 0x24) =
       *(uint *)(lVar80 + 0x24) & 0xfffe3fff | (*(ushort *)((long)pvVar31 + 0xc) & 7) << 0xe;
  lVar80 = *(long *)((long)hal + 0x50);
  lVar81 = *(long *)(lVar80 + 0x1e7a8);
  uVar86 = 8;
  if ((*(ulong *)((long)pvVar31 + 0x14) & 0x400000000) != 0) {
    uVar86 = (*(uint *)(lVar81 + 0x24) >> 0xe & 7) + 9;
  }
  uVar71 = 0xe000e;
  uVar93 = 0x38000;
  uVar41 = 0xe;
  if (uVar86 < 9) {
    uVar72 = 0;
    uVar86 = 0;
  }
  else {
    uVar73 = *(uint *)((long)pvVar31 + 0xc70);
    uVar70 = 0;
    uVar101 = (ulong)((uVar86 >> 1) + uVar73 * 8) / (ulong)uVar86;
    uVar86 = 0x10;
    if (uVar73 < 0x10) {
      uVar86 = uVar73;
    }
    uVar105 = (ulong)uVar86;
    if (uVar86 < (uint)uVar101) {
      uVar105 = uVar101;
    }
    iVar94 = (int)uVar105;
    uVar72 = 0;
    uVar86 = 0;
    if (iVar94 - uVar73 != 0) {
      uVar86 = iVar94 + 1U >> 1;
      iVar98 = (int)(uVar73 + 1) >> 1;
      uVar70 = ((int)uVar73 / 2 + iVar94 * 0x4000) / (int)uVar73;
      iVar97 = iVar98 - ((int)(uVar73 + 1) >> 0x1f) >> 1;
      uVar41 = (int)(iVar97 + uVar86 * 0x4000) / iVar98;
      iVar102 = uVar70 * uVar73 + iVar94 * -0x4000;
      iVar100 = uVar41 * iVar98 + uVar86 * -0x4000;
      uVar72 = ((int)((uVar86 - iVar98) * 0x2000 + iVar97) / iVar98 -
               ((uint)(iVar100 - (iVar100 >> 0x1f)) >> 1)) + 0x80 & 0x3fff;
      uVar93 = (uVar70 & 0x3fff) << 0xe;
      uVar41 = uVar41 & 0x3fff;
      uVar71 = (int)((iVar94 + 1U >> 2) + iVar98 * 0x4000) / (int)uVar86 & 0xffffU |
               (int)((int)(uVar105 >> 1) + uVar73 * 0x4000) / iVar94 << 0x10;
      uVar86 = ((int)((iVar94 - uVar73) * 0x2000 + (int)uVar73 / 2) / (int)uVar73 -
               ((uint)(iVar102 - (iVar102 >> 0x1f)) >> 1)) * 0x4000 + 0x200000 & 0xfffc000;
      uVar70 = 0x20000;
    }
  }
  *(uint *)(lVar81 + 0xcc) = *(uint *)(lVar81 + 0xcc) & 0xf0000000 | uVar41 | uVar93;
  *(uint *)(lVar81 + 0x4a8) = uVar71;
  *(uint *)(lVar81 + 0xd0) = *(uint *)(lVar81 + 0xd0) & 0xf0000000 | uVar72 | uVar86;
  *(uint *)(lVar81 + 0x14) = *(uint *)(lVar81 + 0x14) & 0xfffdffff | uVar70;
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x58),"vdpu_av1d_superres_params");
  *(int *)(lVar81 + 0x164) = iVar94;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x59,*(RK_U32 *)(lVar80 + 0x84));
  lVar80 = *(long *)((long)hal + 0x50);
  lVar81 = *(long *)(lVar80 + 0x1e7a8);
  uVar86 = *(uint *)(lVar81 + 0x1c);
  uVar41 = (*(byte *)((long)pvVar31 + 0x559) & 3) << 5;
  *(uint *)(lVar81 + 0x1c) = uVar86 & 0xffffff9f | uVar41;
  *(uint *)(lVar81 + 0x1c) =
       (uVar86 & 0xffffff87 | uVar41) + (*(uint *)((long)pvVar31 + 0x558) & 3) * 8;
  bVar89 = 0;
  lVar104 = 0;
  uVar93 = 0;
  uVar86 = 0;
  uVar41 = 0;
  uVar70 = 0;
  do {
    if ((1L << (*(byte *)((long)pvVar31 + 0x559) & 0x3f)) * 2 == lVar104) break;
    uVar93 = uVar93 | (uint)*(byte *)((long)pvVar31 + lVar104 + 0x55a) << (bVar89 & 0x1f);
    uVar86 = uVar86 | (uint)*(byte *)((long)pvVar31 + lVar104 + 0x55b) << ((byte)lVar104 & 0x1f);
    uVar70 = uVar70 | (uint)*(byte *)((long)pvVar31 + lVar104 + 0x56a) << (bVar89 & 0x1f);
    uVar41 = uVar41 | (uint)*(byte *)((long)pvVar31 + lVar104 + 0x56b) << ((byte)lVar104 & 0x1f);
    lVar104 = lVar104 + 2;
    bVar89 = bVar89 + 4;
  } while (lVar104 != 0x10);
  *(uint *)(lVar81 + 0x41c) = uVar93;
  *(uint *)(lVar81 + 0x420) = uVar70;
  *(uint *)(lVar81 + 0xd4) = uVar41 & 0xffff | uVar86 << 0x10;
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x58),"vdpu_av1d_set_cdef");
  *(int *)(lVar81 + 0x154) = iVar94;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x55,*(RK_U32 *)(lVar80 + 0x7c));
  lVar80 = *(long *)((long)hal + 0x50);
  lVar81 = *(long *)(lVar80 + 0x1e7a8);
  pbVar92 = (byte *)((long)pvVar31 + 0x546);
  lVar104 = 0;
  uVar86 = 0;
  uVar41 = 0;
  do {
    uVar41 = uVar41 | (uint)*pbVar92 << ((byte)lVar104 & 0x1f);
    uVar86 = uVar86 | (uint)pbVar92[3] << ((byte)lVar104 & 0x1f);
    lVar104 = lVar104 + 2;
    pbVar92 = pbVar92 + 1;
  } while (lVar104 != 6);
  *(uint *)(lVar81 + 0x48) = *(uint *)(lVar81 + 0x48) & 0x3ffffff | uVar41 << 0x1a;
  *(uint *)(lVar81 + 0x4c) = *(uint *)(lVar81 + 0x4c) & 0x3ffffff | uVar86 << 0x1a;
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x58),"vdpu_av1d_set_lr");
  *(int *)(lVar81 + 0x16c) = iVar94;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x5b,*(RK_U32 *)(lVar80 + 0x8c));
  pVVar103 = ctx->regs;
  pvVar67 = mpp_buffer_get_ptr_with_caller(ctx->film_grain_mem,"vdpu_av1d_set_fgs");
  if (*(char *)((long)pvVar31 + 0x68c) == '\0') {
    *(byte *)&pVVar103->swreg7 = *(byte *)&pVVar103->swreg7 & 0x7f;
  }
  else {
    aVar23 = pVVar103->swreg7;
    uVar86 = (uint)(*(char *)((long)pvVar31 + 0x696) != '\0') << 8;
    pVVar103->swreg7 = (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar23 & 0xfffffeff | uVar86);
    uVar41 = (uint)(*(char *)((long)pvVar31 + 0x697) != '\0') << 9;
    pVVar103->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar23 & 0xfffffcff | uVar86 | uVar41);
    pVVar103->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar23 & 0xfffff8ff | uVar86 | uVar41 |
         (uint)(*(char *)((long)pvVar31 + 0x698) != '\0') << 10);
    pVVar103->swreg8 =
         (anon_struct_4_6_bb133afb_for_swreg8)
         ((uint)pVVar103->swreg8 & 0xfffffff0 | *(byte *)((long)pvVar31 + 0x68d) & 0xf ^ 8);
    if (*(char *)((long)pvVar31 + 0x68e) == '\0') {
      uVar86 = (*(byte *)((long)pvVar31 + 0x727) ^ 0x80) << 0x11;
      aVar24 = pVVar103->swreg28;
      pVVar103->swreg28 = (anon_struct_4_4_56b39857_for_swreg28)((uint)aVar24 & 0xfe01ffff | uVar86)
      ;
      uVar41 = (*(byte *)((long)pvVar31 + 0x728) ^ 0x80) << 9;
      pVVar103->swreg28 =
           (anon_struct_4_4_56b39857_for_swreg28)((uint)aVar24 & 0xfe0001ff | uVar86 | uVar41);
      pVVar103->swreg28 =
           (anon_struct_4_4_56b39857_for_swreg28)
           ((uint)aVar24 & 0xfe000000 | uVar86 | uVar41 |
           *(ushort *)((long)pvVar31 + 0x730) & 0x1ff ^ 0x100);
      uVar86 = (*(byte *)((long)pvVar31 + 0x729) ^ 0x80) << 0x11;
      aVar50 = pVVar103->swreg29;
      pVVar103->swreg29 = (anon_struct_4_4_36e9efea_for_swreg29)((uint)aVar50 & 0xfe01ffff | uVar86)
      ;
      uVar41 = (*(byte *)((long)pvVar31 + 0x72a) ^ 0x80) << 9;
      pVVar103->swreg29 =
           (anon_struct_4_4_36e9efea_for_swreg29)((uint)aVar50 & 0xfe0001ff | uVar86 | uVar41);
      aVar50 = (anon_struct_4_4_36e9efea_for_swreg29)
               ((uint)aVar50 & 0xfe000000 | uVar86 | uVar41 |
               *(ushort *)((long)pvVar31 + 0x732) & 0x1ff ^ 0x100);
    }
    else {
      pVVar103->swreg28 =
           (anon_struct_4_4_56b39857_for_swreg28)((uint)pVVar103->swreg28 & 0xfe000000 | 0x8000);
      aVar50 = (anon_struct_4_4_36e9efea_for_swreg29)((uint)pVVar103->swreg29 & 0xfe000000 | 0x8000)
      ;
    }
    pVVar103->swreg29 = aVar50;
    uVar86 = (*(byte *)((long)pvVar31 + 0x692) & 1) << 0xb;
    aVar23 = pVVar103->swreg7;
    pVVar103->swreg7 = (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar23 & 0xfffff7ff | uVar86);
    uVar41 = (*(byte *)((long)pvVar31 + 0x693) & 1) << 0xc;
    pVVar103->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar23 & 0xffffe7ff | uVar86 | uVar41);
    uVar70 = (*(byte *)((long)pvVar31 + 0x68e) & 1) << 0xd;
    pVVar103->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar23 & 0xffffc7ff | uVar86 | uVar41 | uVar70);
    pVVar103->swreg7 =
         (anon_struct_4_14_914205bb_for_swreg7)
         ((uint)aVar23 & 0xc00007ff | uVar86 | uVar41 | uVar70 |
         (uint)*(ushort *)((long)pvVar31 + 0x72c) << 0xe);
    scaling_lut = &ctx->fgsmem;
    init_scaling_function
              ((RK_U8 (*) [2])((long)pvVar31 + 0x699),*(RK_U8 *)((long)pvVar31 + 0x696),
               scaling_lut->scaling_lut_y);
    if (*(char *)((long)pvVar31 + 0x68e) == '\0') {
      init_scaling_function
                ((RK_U8 (*) [2])((long)pvVar31 + 0x6b5),*(RK_U8 *)((long)pvVar31 + 0x697),
                 (ctx->fgsmem).scaling_lut_cb);
      init_scaling_function
                ((RK_U8 (*) [2])((long)pvVar31 + 0x6c9),*(RK_U8 *)((long)pvVar31 + 0x698),
                 (ctx->fgsmem).scaling_lut_cr);
    }
    else {
      memcpy((ctx->fgsmem).scaling_lut_cb,scaling_lut,0x100);
      memcpy((ctx->fgsmem).scaling_lut_cr,scaling_lut,0x100);
    }
    lVar80 = 0;
    do {
      if (lVar80 != 0x18) {
        ar_coeffs_y[lVar80] = *(byte *)((long)pvVar31 + lVar80 + 0x6dd) - 0x80;
      }
      refs_selected[lVar80] = *(byte *)((long)pvVar31 + lVar80 + 0x6f5) - 0x80;
      *(uint *)(mf_types + lVar80 * 4) = *(byte *)((long)pvVar31 + lVar80 + 0x70e) - 0x80;
      lVar80 = lVar80 + 1;
    } while (lVar80 != 0x19);
    bVar89 = *(byte *)((long)pvVar31 + 0x68f);
    iVar94 = *(byte *)((long)pvVar31 + 0x690) + 6;
    uVar4 = *(ushort *)((long)pvVar31 + 0xe);
    bVar69 = (char)uVar4 - 8;
    uVar86 = 0x80 << (bVar69 & 0x1f);
    bVar90 = *(byte *)((long)pvVar31 + 0x691);
    iVar102 = -uVar86;
    iVar97 = ~uVar86 + (0x100 << (bVar69 & 0x1f));
    GenerateLumaGrainBlock
              ((RK_S32 (*) [82])ref_count,(uint)uVar4,*(RK_U8 *)((long)pvVar31 + 0x696),(uint)bVar90
               ,(uint)bVar89,ar_coeffs_y,iVar94,iVar102,iVar97,*(RK_U16 *)((long)pvVar31 + 0x72c));
    GenerateChromaGrainBlock
              ((RK_S32 (*) [82])ref_count,(RK_S32 (*) [44])cur_offset,(RK_S32 (*) [44])local_1a58,
               (uint)uVar4,*(RK_U8 *)((long)pvVar31 + 0x696),*(RK_U8 *)((long)pvVar31 + 0x697),
               *(RK_U8 *)((long)pvVar31 + 0x698),(uint)bVar90,(uint)bVar89,refs_selected,
               (RK_S32 *)mf_types,iVar94,iVar102,iVar97,*(RK_U8 *)((long)pvVar31 + 0x68e),
               *(RK_U16 *)((long)pvVar31 + 0x72c));
    pRVar68 = (ctx->fgsmem).cropped_luma_grain_block;
    puVar82 = local_865c;
    lVar80 = 0;
    do {
      lVar81 = 0;
      do {
        pRVar68[lVar81] = *(RK_S16 *)(puVar82 + lVar81 * 4);
        lVar81 = lVar81 + 1;
      } while (lVar81 != 0x40);
      lVar80 = lVar80 + 1;
      pRVar68 = pRVar68 + 0x40;
      puVar82 = puVar82 + 0x148;
    } while (lVar80 != 0x40);
    pRVar68 = (ctx->fgsmem).cropped_chroma_grain_block + 1;
    puVar107 = local_1620;
    puVar82 = local_3040;
    lVar80 = 0;
    do {
      lVar81 = 0;
      do {
        pRVar68[lVar81 * 2 + -1] = *(RK_S16 *)(puVar82 + lVar81 * 4);
        pRVar68[lVar81 * 2] = *(RK_S16 *)(puVar107 + lVar81 * 4);
        lVar81 = lVar81 + 1;
      } while (lVar81 != 0x20);
      lVar80 = lVar80 + 1;
      pRVar68 = pRVar68 + 0x40;
      puVar107 = puVar107 + 0xb0;
      puVar82 = puVar82 + 0xb0;
    } while (lVar80 != 0x20);
    memcpy(pvVar67,scaling_lut,0x3300);
    mpp_buffer_sync_end_f(ctx->film_grain_mem,0,"vdpu_av1d_set_fgs");
    (pVVar103->addr_cfg).swreg94 = (anon_struct_4_1_5b01d9b1_for_swreg94)0x0;
    aVar51 = (anon_struct_4_1_5b01d5f0_for_swreg95)
             mpp_buffer_get_fd_with_caller(ctx->film_grain_mem,"vdpu_av1d_set_fgs");
    (pVVar103->addr_cfg).swreg95 = aVar51;
    if ((((uint)pVVar103->swreg7 & 0x80) != 0) && (((byte)hal_av1d_debug & 8) != 0)) {
      _mpp_log_l(4,"hal_av1d_vdpu","NOTICE: filmgrain enabled.\n",(char *)0x0);
    }
  }
  lVar80 = *(long *)((long)hal + 0x50);
  pvVar67 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar80 + 0x30),"vdpu_av1d_set_prob");
  lVar81 = *(long *)(lVar80 + 0x1e7a8);
  memcpy(pvVar67,*(void **)((long)pvVar31 + 0xc88),0x2fe0);
  if ((*(byte *)((long)pvVar31 + 0x528) & 0xfd) == 0) {
    memcpy((void *)((long)pvVar67 + 0x890),*(void **)((long)pvVar31 + 0xc90),0x8a);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar80 + 0x30),0,"vdpu_av1d_set_prob");
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x38),"vdpu_av1d_set_prob");
  *(int *)(lVar81 + 0x2ac) = iVar94;
  iVar94 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar80 + 0x30),"vdpu_av1d_set_prob");
  pVVar39 = local_9380;
  *(int *)(lVar81 + 0x2b4) = iVar94;
  bVar89 = ctx->tile_transpose;
  pVVar103 = ctx->regs;
  uVar4 = *(ushort *)((long)pvVar31 + 0x20);
  uVar86 = (uint)uVar4;
  uVar5 = *(ushort *)((long)pvVar31 + 0x1c);
  uVar101 = (ulong)uVar4 % (ulong)uVar5;
  uVar41 = (uint)(uVar101 == 0) << 0xb;
  aVar48 = pVVar103->swreg11;
  pVVar103->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar48 & 0xfffff7ff | uVar41);
  if (bVar89 != 0) {
    uVar86 = (int)uVar101 * (uint)*(ushort *)((long)pvVar31 + 0x1e) + (uint)uVar4 / (uint)uVar5;
  }
  uVar70 = 2;
  if (*(ushort *)((long)pvVar31 + 0x1c) < 2) {
    uVar70 = (uint)(1 < *(ushort *)((long)pvVar31 + 0x1e)) * 2;
  }
  aVar25 = pVVar103->swreg10;
  pVVar103->swreg10 = (anon_struct_4_6_c35305d8_for_swreg10)((uint)aVar25 & 0xfffffffd | uVar70);
  uVar93 = (*(ushort *)((long)pvVar31 + 0x1c) & 0x7f) << 0x11;
  pVVar103->swreg10 =
       (anon_struct_4_6_c35305d8_for_swreg10)((uint)aVar25 & 0xff01fffd | uVar70 | uVar93);
  uVar4 = *(ushort *)((long)pvVar31 + 0x1e);
  pVVar103->swreg9 =
       (anon_struct_4_10_545f55a1_for_swreg9)((uint)pVVar103->swreg9 & 0xfffff | uVar86 << 0x14);
  pVVar103->swreg10 =
       (anon_struct_4_6_c35305d8_for_swreg10)
       (bVar89 & 1 | (uint)aVar25 & 0xff0003fc | uVar70 | uVar93 | (uVar4 & 0x7f) << 10);
  pVVar103->swreg11 =
       (anon_struct_4_14_b2705f36_for_swreg11)
       ((uint)aVar48 & 0x3ffff7ff | uVar41 | *(int *)((long)pvVar31 + 0x524) << 0x1e);
  if ((uVar70 != 0) && (((byte)hal_av1d_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_av1d_vdpu","NOTICE: tile enabled.\n",(char *)0x0);
  }
  aVar52 = (anon_struct_4_1_1bae43a1_for_swreg167)
           mpp_buffer_get_fd_with_caller(ctx->tile_info,"vdpu_av1d_set_tile_info_regs");
  pHVar66 = local_9358;
  (pVVar103->addr_cfg).swreg167 = aVar52;
  (pVVar103->addr_cfg).swreg166 = (anon_struct_4_1_1bae4762_for_swreg166)0x0;
  uVar86 = (*(byte *)((long)pvVar31 + 0x52d) & 1) << 0x1e;
  aVar23 = pVVar39->swreg7;
  pVVar39->swreg7 = (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar23 & 0xbfffffff | uVar86);
  uVar41 = (*(byte *)((long)pvVar31 + 0x693) & 1) << 0xc;
  pVVar39->swreg7 =
       (anon_struct_4_14_914205bb_for_swreg7)((uint)aVar23 & 0xbfffefff | uVar86 | uVar41);
  aVar23 = (anon_struct_4_14_914205bb_for_swreg7)
           (((uint)aVar23 & 0xbfffeff9 | uVar86 | uVar41) +
           (*(byte *)((long)pvVar31 + 0x54d) & 3) * 2);
  pVVar39->swreg7 = aVar23;
  pVVar39->swreg7 =
       (anon_struct_4_14_914205bb_for_swreg7)
       ((uint)aVar23 & 0xfffffffe | *(byte *)((long)pvVar31 + 0x54c) & 1);
  aVar26 = pVVar39->swreg8;
  uVar86 = (uint)(*(char *)((long)pvVar31 + 0x528) == '\0') << 0x10;
  pVVar39->swreg8 = (anon_struct_4_6_bb133afb_for_swreg8)((uint)aVar26 & 0xfffeffff | uVar86);
  uVar41 = (uint)*(byte *)((long)pvVar31 + 0x54e) << 8;
  pVVar39->swreg8 =
       (anon_struct_4_6_bb133afb_for_swreg8)((uint)aVar26 & 0xfffe00ff | uVar86 | uVar41);
  uVar70 = (*(ushort *)((long)pvVar31 + 0xe) & 3) << 6;
  pVVar39->swreg8 =
       (anon_struct_4_6_bb133afb_for_swreg8)((uint)aVar26 & 0xfffe003f | uVar86 | uVar41 | uVar70);
  pVVar39->swreg8 =
       (anon_struct_4_6_bb133afb_for_swreg8)
       ((uint)aVar26 & 0xfffe000f | uVar86 | uVar41 | uVar70 |
       (*(ushort *)((long)pvVar31 + 0xe) & 3) << 4);
  uVar41 = (*(byte *)((long)pvVar31 + 0xc64) & 7) << 8;
  aVar48 = pVVar39->swreg11;
  pVVar39->swreg11 = (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar48 & 0xfffff8ff | uVar41);
  uVar70 = *(uint *)((long)pvVar31 + 0x14) >> 0x13 & 0x80;
  pVVar39->swreg11 =
       (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar48 & 0xfffff87f | uVar41 | uVar70);
  uVar93 = *(uint *)((long)pvVar31 + 0x14) >> 0x1a & 0xffffffe0;
  pVVar39->swreg11 =
       (anon_struct_4_14_b2705f36_for_swreg11)((uint)aVar48 & 0xfffff84f | uVar41 | uVar70 | uVar93)
  ;
  uVar71 = (uint)((ulong)*(undefined8 *)((long)pvVar31 + 0x14) >> 0x23);
  uVar86 = uVar71 * 0x8000000 + 0x10000000 & 0x38000000;
  if ((uVar71 & 7) == 0) {
    uVar86 = 0;
  }
  pVVar39->swreg11 =
       (anon_struct_4_14_b2705f36_for_swreg11)
       ((uint)aVar48 & 0xc7fff84f | uVar41 | uVar70 | uVar93 | uVar86);
  pVVar39->swreg12 =
       (anon_struct_4_8_66c0642b_for_swreg12)
       ((*(ushort *)((long)pvVar31 + 0x14) >> 2 & 0x400) + ((uint)pVVar39->swreg12 & 0xfff803ff) +
       0x7800);
  aVar27 = pVVar39->swreg13;
  pVVar39->swreg13 = (anon_struct_4_10_0fd9c99d_for_swreg13)((uint)aVar27 & 0xfffffe07);
  puVar82 = &(pVVar39->swreg14).field_0x1;
  *puVar82 = *puVar82 & 0xc0;
  puVar82 = &(pVVar39->swreg15).field_0x1;
  *puVar82 = *puVar82 & 0xc0;
  puVar82 = &(pVVar39->swreg16).field_0x1;
  *puVar82 = *puVar82 & 0xc0;
  puVar82 = &(pVVar39->swreg17).field_0x1;
  *puVar82 = *puVar82 & 0xc0;
  puVar82 = &(pVVar39->swreg18).field_0x1;
  *puVar82 = *puVar82 & 0xc0;
  puVar82 = &(pVVar39->swreg19).field_0x1;
  *puVar82 = *puVar82 & 0xc0;
  aVar28 = pVVar39->swreg31;
  pVVar39->swreg31 = (anon_struct_4_7_653512df_for_swreg31)((uint)aVar28 & 0xffffc0ff);
  aVar29 = pVVar39->swreg32;
  pVVar39->swreg32 = (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar29 & 0xffffc0ff);
  uVar86 = (uint)*(byte *)((long)pvVar31 + 0x54f) << 0x19;
  pVVar39->swreg13 = (anon_struct_4_10_0fd9c99d_for_swreg13)((uint)aVar27 & 0x1fffe07 | uVar86);
  uVar41 = (*(byte *)((long)pvVar31 + 0x550) & 0x7f) << 0x12;
  pVVar39->swreg13 =
       (anon_struct_4_10_0fd9c99d_for_swreg13)((uint)aVar27 & 0x3fe07 | uVar86 | uVar41);
  uVar70 = (*(byte *)((long)pvVar31 + 0x552) & 0x7f) << 0xb;
  pVVar39->swreg13 =
       (anon_struct_4_10_0fd9c99d_for_swreg13)((uint)aVar27 & 0x607 | uVar86 | uVar41 | uVar70);
  pVVar39->swreg47 =
       (anon_struct_4_5_8bdbaba8_for_swreg47)
       ((uint)pVVar39->swreg47 & 0x87ffffff | (*(byte *)((long)pvVar31 + 0x555) & 0xf) << 0x1b);
  pVVar39->swreg48 =
       (anon_struct_4_5_5cd422b8_for_swreg48)
       ((uint)pVVar39->swreg48 & 0x87ffffff | (*(byte *)((long)pvVar31 + 0x556) & 0xf) << 0x1b);
  pVVar39->swreg49 =
       (anon_struct_4_4_ee14b1da_for_swreg49)
       ((uint)pVVar39->swreg49 & 0xfffc3fff | (*(byte *)((long)pvVar31 + 0x557) & 0xf) << 0xe);
  pVVar39->swreg13 =
       (anon_struct_4_10_0fd9c99d_for_swreg13)
       ((uint)aVar27 & 0x407 | uVar86 | uVar41 | uVar70 |
       (*(byte *)((long)pvVar31 + 0xc5c) & 1) << 9);
  pVVar39->swreg28 =
       (anon_struct_4_4_56b39857_for_swreg28)
       ((uint)pVVar39->swreg28 & 0x1ffffff | (uint)*(byte *)((long)pvVar31 + 0x551) << 0x19);
  pVVar39->swreg29 =
       (anon_struct_4_4_36e9efea_for_swreg29)
       ((uint)pVVar39->swreg29 & 0x1ffffff | (uint)*(byte *)((long)pvVar31 + 0x553) << 0x19);
  uVar86 = (*(byte *)((long)pvVar31 + 0xc84) & 0xf) << 0x1a;
  if (*(byte *)((long)pvVar31 + 0xc84) == 0) {
    uVar86 = 0x4000000;
  }
  pVVar39->swreg31 = (anon_struct_4_7_653512df_for_swreg31)((uint)aVar28 & 0xc3ffc0ff | uVar86);
  uVar86 = (*(byte *)((long)pvVar31 + 0xc85) & 0xf) << 0x1a;
  if (*(byte *)((long)pvVar31 + 0xc85) == 0) {
    uVar86 = 0x4000000;
  }
  pVVar39->swreg32 = (anon_struct_4_7_66f87b3f_for_swreg32)((uint)aVar29 & 0xc3ffc0ff | uVar86);
  uVar86 = ctx->luma_size;
  uVar41 = *(uint *)((long)pvVar31 + 0xc7c) & 0xfffffff0;
  aVar53 = (anon_struct_4_1_4038c17b_for_swreg65)
           mpp_buffer_get_fd_with_caller(*local_9358->buf,"vdpu_av1d_gen_regs");
  (local_9380->addr_cfg).swreg65 = aVar53;
  aVar54 = (anon_struct_4_1_82573765_for_swreg99)
           mpp_buffer_get_fd_with_caller(*pHVar66->buf,"vdpu_av1d_gen_regs");
  pVVar103 = local_9380;
  (local_9380->addr_cfg).swreg99 = aVar54;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),99,uVar86);
  aVar55 = (anon_struct_4_1_169ba666_for_swreg133)
           mpp_buffer_get_fd_with_caller(*pHVar66->buf,"vdpu_av1d_gen_regs");
  (pVVar103->addr_cfg).swreg133 = aVar55;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x85,(uVar86 >> 1) + uVar86 + 0x40);
  pVVar103->swreg258 =
       (anon_struct_4_1_a6cf583c_for_swreg258)(*(int *)((long)hal + 0x10) + 0x7fU & 0xffffff80);
  pVVar103->swreg5 =
       (anon_struct_4_25_9d147ffd_for_swreg5)
       ((uint)pVVar103->swreg5 & 0x1ffffff | *(int *)((long)pvVar31 + 0xc7c) << 0x1c);
  pVVar103->swreg6 =
       (anon_struct_4_1_a31bdfb1_for_swreg6)(*(int *)((long)hal + 0x10) + 0x7fU & 0xffffff80);
  pVVar103->swreg259 = (anon_struct_4_1_901bd7f6_for_swreg259)0x0;
  (pVVar103->addr_cfg).swreg168 = (anon_struct_4_1_c37ab5d0_for_swreg168)0x0;
  aVar56 = (anon_struct_4_1_c37ab20f_for_swreg169)
           mpp_buffer_get_fd_with_caller(streambuf,"vdpu_av1d_gen_regs");
  (pVVar103->addr_cfg).swreg169 = aVar56;
  mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0xa9,uVar41);
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","stream len %d\n",(char *)0x0,(ulong)*(uint *)((long)hal + 0x10));
  }
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","stream offset %d\n",(char *)0x0,(ulong)uVar41);
  }
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","stream tag_size %d\n",(char *)0x0,
               (ulong)*(uint *)((long)pvVar31 + 0xc7c));
  }
  if (((byte)hal_av1d_debug & 8) != 0) {
    _mpp_log_l(4,"hal_av1d_vdpu","stream start_bit %d\n",(char *)0x0,
               (ulong)((uint)pVVar103->swreg5 >> 0x19));
  }
  *(undefined2 *)&pVVar103->swreg314 = 0x40;
  aVar57 = (anon_struct_4_1_4e3bf742_for_swreg175)
           mpp_buffer_get_fd_with_caller(ctx->tile_buf,"vdpu_av1d_gen_regs");
  (pVVar103->addr_cfg).swreg175 = aVar57;
  aVar58 = (anon_struct_4_1_23975d0d_for_swreg177)
           mpp_buffer_get_fd_with_caller(ctx->tile_buf,"vdpu_av1d_gen_regs");
  (pVVar103->addr_cfg).swreg177 = aVar58;
  pVVar103->swreg55 =
       (anon_struct_4_4_c9f88b99_for_swreg55)((uint)pVVar103->swreg55 & 0x7fff0000 | 8);
  uVar86 = (uint)pVVar103->swreg58 & 0xfffff800;
  pVVar103->swreg58 = (anon_struct_4_9_1a5abba5_for_swreg58)(uVar86 + 0x210);
  puVar82 = &(pVVar103->swreg266).field_0x3;
  *puVar82 = *puVar82 & 0xbf;
  pVVar103->swreg265 =
       (anon_struct_4_6_3955e65b_for_swreg265)((uint)pVVar103->swreg265 & 0xf00000ff | 0x1004000);
  pVVar103->swreg318 = (anon_struct_4_2_4fb738c6_for_swreg318)0x8fffffff;
  pVVar103->swreg319 = (anon_struct_4_2_b6465c06_for_swreg319)0x8fffffff;
  aVar30 = (pVVar103->vdpu_av1d_pp_cfg).swreg320;
  (pVVar103->vdpu_av1d_pp_cfg).swreg320 = (anon_struct_4_11_260badcd_for_swreg320)((uint)aVar30 | 1)
  ;
  puVar82 = &(pVVar103->vdpu_av1d_pp_cfg).swreg322.field_0x3;
  *puVar82 = *puVar82 & 7;
  *(undefined2 *)&(pVVar103->vdpu_av1d_pp_cfg).swreg394.field_0x2 = 0x101;
  uVar41 = (uint)local_9350;
  (pVVar103->vdpu_av1d_pp_cfg).swreg331 =
       (anon_struct_4_2_1423c012_for_swreg331)((uVar41 & 0xfffe) << 0xf | (uint)(uVar3 >> 1));
  (pVVar103->vdpu_av1d_pp_cfg).swreg332 =
       (anon_struct_4_2_35d84258_for_swreg332)(uVar41 << 0x10 | (uint)uVar3);
  (pVVar103->vdpu_av1d_pp_cfg).swreg329 =
       (anon_struct_4_2_bc7a340b_for_swreg329)(local_936c << 0x10 | local_936c & 0xffff);
  if (ctx->fbc_en == '\0') {
    RVar42 = local_9370 * local_936c;
    MVar44 = mpp_frame_get_fmt(mframe);
    uVar86 = 0xc0000;
    if ((MVar44 & 0xfffff) != MPP_FMT_YUV420SP) {
      uVar86 = 0;
    }
    (pVVar103->vdpu_av1d_pp_cfg).swreg322 =
         (anon_struct_4_5_aa102880_for_swreg322)
         ((uint)(pVVar103->vdpu_av1d_pp_cfg).swreg322 & 0xff83ffff | uVar86);
    aVar59 = (anon_struct_4_1_111c466e_for_swreg326)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (pVVar103->vdpu_av1d_pp_cfg).swreg326 = aVar59;
    aVar60 = (anon_struct_4_1_6d573f12_for_swreg328)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (pVVar103->vdpu_av1d_pp_cfg).swreg328 = aVar60;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x48),0x148,RVar42);
  }
  else {
    RVar42 = 8;
    if ((((*(ushort *)&(pVVar103->swreg5).field_0x1 & 0x240) == 0) &&
        ((uint)pVVar103->swreg14 < 0x4000000)) && ((uint)pVVar103->swreg15 < 0x4000000)) {
      RVar42 = (uint)(0x3ffffff < (uint)pVVar103->swreg18) << 3;
    }
    uVar70 = uVar41;
    if (8 < *(ushort *)((long)pvVar31 + 0xe)) {
      uVar70 = uVar41 * 2;
    }
    (pVVar103->vdpu_av1d_pp_cfg).swreg329 =
         (anon_struct_4_2_bc7a340b_for_swreg329)(local_936c & 0xffff | uVar70 << 0x10);
    uVar93 = uVar41 * 2;
    if (*(ushort *)((long)pvVar31 + 0xe) < 9) {
      uVar93 = uVar41;
    }
    (pVVar103->vdpu_av1d_pp_cfg).swreg329 =
         (anon_struct_4_2_bc7a340b_for_swreg329)(uVar93 & 0xffff | uVar70 << 0x10);
    pVVar103->swreg58 = (anon_struct_4_9_1a5abba5_for_swreg58)(uVar86 | 0x6210);
    (pVVar103->vdpu_av1d_pp_cfg).swreg320 =
         (anon_struct_4_11_260badcd_for_swreg320)((uint)aVar30 | 9);
    uVar86 = uVar41 * -0x10000000;
    if ((local_9350 & 0xf) == 0) {
      uVar86 = uVar41 & 0xf;
    }
    uVar93 = uVar3 + RVar42;
    uVar70 = uVar93 & 0xf;
    uVar41 = 0x10 - uVar70;
    if (uVar70 == 0) {
      uVar41 = 0;
    }
    (pVVar103->vdpu_av1d_pp_cfg).swreg321 =
         (anon_struct_4_7_294d6117_for_swreg321)
         ((uint)(pVVar103->vdpu_av1d_pp_cfg).swreg321 & 0xfffff9ff | 0x400);
    (pVVar103->vdpu_av1d_pp_cfg).swreg503 =
         (anon_struct_4_8_2410b66b_for_swreg503)
         ((uVar41 & 0xf) << 0x18 |
          RVar42 << 0x10 | (uint)*(ushort *)&(pVVar103->vdpu_av1d_pp_cfg).swreg503 | uVar86);
    mpp_frame_set_offset_y(mframe,RVar42);
    mpp_frame_set_ver_stride(mframe,uVar41 + uVar93);
    puVar82 = &(pVVar103->vdpu_av1d_pp_cfg).swreg322.field_0x2;
    *puVar82 = *puVar82 & 0x83;
    aVar59 = (anon_struct_4_1_111c466e_for_swreg326)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (pVVar103->vdpu_av1d_pp_cfg).swreg326 = aVar59;
    aVar60 = (anon_struct_4_1_6d573f12_for_swreg328)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (pVVar103->vdpu_av1d_pp_cfg).swreg328 = aVar60;
    aVar61 = (anon_struct_4_1_37abd1af_for_swreg505)
             mpp_buffer_get_fd_with_caller(buffer,"vdpu_av1d_gen_regs");
    (pVVar103->vdpu_av1d_pp_cfg).swreg505 = aVar61;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    VdpuAv1dRegCtx *ctx = (VdpuAv1dRegCtx *)p_hal->reg_ctx;
    VdpuAv1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    MppFrame mframe;
    MppBuffer buffer = NULL;
    MppBuffer streambuf = NULL;
    RK_U32 height = dxva->height;
    RK_U32 width = dxva->width;
    RK_U32 hor_stride;
    RK_U32 ver_stride;
    HalBuf *tile_out_buf;
    RK_U32 num_tile_cols = 1 << dxva->tile_cols_log2;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    if (p_hal->fast_mode) {
        RK_U32 i = 0;

        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                break;
            }
        }
    }

    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));

    vdpu_av1d_setup_tile_bufs(p_hal, dxva);

    if (!ctx->filter_mem || height > ctx->height || num_tile_cols > ctx->num_tile_cols) {
        if (ctx->filter_mem)
            vdpu_av1d_filtermem_release(ctx);
        ret = vdpu_av1d_filtermem_alloc(p_hal, ctx, dxva);
        if (!ret) {
            mpp_err("filt buffer get fail\n");
            vdpu_av1d_filtermem_release(ctx);
        }
    }

    ctx->width = width;
    ctx->height = height;
    ctx->num_tile_cols = num_tile_cols;
    mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
    mpp_buf_slot_get_prop(p_hal ->slots, task->dec.output, SLOT_BUFFER, &buffer);
    mpp_buf_slot_get_prop(p_hal ->packet_slots, task->dec.input, SLOT_BUFFER, &streambuf);
    tile_out_buf = hal_bufs_get_buf(ctx->tile_out_bufs, task->dec.output);
    hor_stride = mpp_frame_get_hor_stride(mframe);
    ver_stride = mpp_frame_get_ver_stride(mframe);

    ctx->ver_stride = ver_stride;

    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

    ctx->fbc_en = !!MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe));

    AV1D_DBG(AV1D_DBG_LOG, "bitdepth %d fmt %d [%d : %d] wxh [%d : %d] uxv [%d : %d]\n",
             dxva->bitdepth, mpp_frame_get_fmt(mframe),
             dxva->format.subsampling_x, dxva->format.subsampling_y,
             ctx->width, ctx->height,
             ctx->hor_stride, ctx->ver_stride);

    regs->swreg1.sw_dec_abort_e     = 0;
    regs->swreg1.sw_dec_e           = 1;
    regs->swreg1.sw_dec_tile_int_e  = 0;
    regs->swreg2.sw_dec_clk_gate_e = 1;

    regs->swreg3.sw_dec_mode           = 17; // av1 mode
    regs->swreg3.sw_skip_mode          = dxva->coding.skip_mode;
    regs->swreg3.sw_dec_out_ec_byte_word = 0; // word align
    regs->swreg3.sw_write_mvs_e        = 1;
    regs->swreg3.sw_dec_out_ec_bypass  = 1;

    regs->swreg5.sw_tempor_mvp_e        = dxva->coding.use_ref_frame_mvs;
    regs->swreg5.sw_delta_lf_res_log    = dxva->loop_filter.delta_lf_res;
    regs->swreg5.sw_delta_lf_multi      = dxva->loop_filter.delta_lf_multi;
    regs->swreg5.sw_delta_lf_present    = dxva->loop_filter.delta_lf_present;
    regs->swreg5.sw_disable_cdf_update  = dxva->coding.disable_cdf_update;
    regs->swreg5.sw_allow_warp          = dxva->coding.warped_motion;
    regs->swreg5.sw_show_frame          = dxva->format.show_frame;
    regs->swreg5.sw_switchable_motion_mode  = dxva->coding.switchable_motion_mode;
    regs->swreg5.sw_enable_cdef         = !(dxva->cdef.bits == 0 && dxva->cdef.damping == 0 &&
                                            dxva->cdef.y_strengths[0].primary == 0 &&
                                            dxva->cdef.y_strengths[0].secondary == 0 &&
                                            dxva->cdef.uv_strengths[0].primary == 0 &&
                                            dxva->cdef.uv_strengths[0].secondary == 0);
    regs->swreg5.sw_allow_masked_compound   = dxva->coding.masked_compound;
    regs->swreg5.sw_allow_interintra    = dxva->coding.interintra_compound;
    regs->swreg5.sw_enable_intra_edge_filter = dxva->coding.intra_edge_filter;
    regs->swreg5.sw_allow_filter_intra  = dxva->coding.filter_intra;
    regs->swreg5.sw_enable_jnt_comp     = dxva->coding.jnt_comp;
    regs->swreg5.sw_enable_dual_filter  = dxva->coding.dual_filter;
    regs->swreg5.sw_reduced_tx_set_used = dxva->coding.reduced_tx_set;
    regs->swreg5.sw_allow_screen_content_tools = dxva->coding.screen_content_tools;
    regs->swreg5.sw_allow_intrabc       = dxva->coding.intrabc;

    regs->swreg5.sw_force_interger_mv   = dxva->coding.integer_mv;

    vdpu_av1d_set_global_model(p_hal, dxva);
    vdpu_av1d_set_tile_info_mem(p_hal, dxva);

    if ((dxva->format.frame_type && (dxva->format.frame_type != AV1_FRAME_INTRA_ONLY))
        || dxva->coding.intrabc) {
        vdpu_av1d_set_reference_frames(p_hal, ctx, dxva);
    }
    vdpu_av1d_set_segmentation(ctx, dxva);
    vdpu_av1d_set_loopfilter(p_hal, dxva);
    vdpu_av1d_set_picture_dimensions(p_hal, dxva);
    vdpu_av1d_set_cdef(p_hal, dxva);
    vdpu_av1d_set_lr(p_hal, dxva);
    vdpu_av1d_set_fgs(ctx, dxva);
    vdpu_av1d_set_prob(p_hal, dxva);
    vdpu_av1d_set_tile_info_regs(ctx, dxva);

#if DUMP_AV1_DATAS/* dump buffer */
    {
        char name[128];
        char *path = "/data/video";
        static int g_frame_num = 0;
        FILE *fp;
        RK_U32 i;
        RK_U32 *data;
        RK_U32 size;

        data = mpp_buffer_get_ptr(ctx->global_model);
        size = MPP_ALIGN(GLOBAL_MODEL_SIZE, 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/global_mode_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->tile_info);
        size = AV1_TILE_INFO_SIZE;
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/tile_info_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(streambuf);
        size = MPP_ALIGN(p_hal->strm_len, 1);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/stream_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        fwrite((RK_U8*)data, 1, size, fp);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->film_grain_mem);
        size = MPP_ALIGN(sizeof(AV1FilmGrainMemory), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/film_grain_mem_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        data = mpp_buffer_get_ptr(ctx->prob_tbl_out_base);
        size = MPP_ALIGN(sizeof(AV1CDFs), 2048);
        memset(name, 0, sizeof(name));
        sprintf(name, "%s/prob_tbl_out_%d.txt", path, g_frame_num);
        fp = fopen(name, "wb");
        for ( i = 0; i < size / 4; i++)
            fprintf(fp, "%08x\n", data[i]);
        fflush(fp);
        fclose(fp);

        g_frame_num ++;
    }
#endif

    regs->swreg7.sw_blackwhite_e    = dxva->format.mono_chrome;
    regs->swreg7.sw_clip_to_restricted_range  = dxva->film_grain.clip_to_restricted_range;
    regs->swreg7.sw_delta_q_res_log     = dxva->quantization.delta_q_res;
    regs->swreg7.sw_delta_q_present     = dxva->quantization.delta_q_present;

    regs->swreg8.sw_idr_pic_e           = !dxva->format.frame_type;
    regs->swreg8.sw_quant_base_qindex   = dxva->quantization.base_qindex;
    regs->swreg8.sw_bit_depth_y_minus8  = dxva->bitdepth - 8;
    regs->swreg8.sw_bit_depth_c_minus8  = dxva->bitdepth - 8;

    regs->swreg11.sw_mcomp_filt_type    = dxva->interp_filter;
    regs->swreg11.sw_high_prec_mv_e     = dxva->coding.high_precision_mv;
    regs->swreg11.sw_comp_pred_mode     = dxva->coding.reference_mode ? 2 : 0;
    regs->swreg11.sw_transform_mode     = dxva->coding.tx_mode ? (dxva->coding.tx_mode + 2) : 0;
    regs->swreg12.sw_max_cb_size        = dxva->coding.use_128x128_superblock ? 7 : 6;;
    regs->swreg12.sw_min_cb_size        = 3;

    /* unused in comdel */
    regs->swreg12.sw_av1_comp_pred_fixed_ref    = 0;
    regs->swreg13.sw_comp_pred_var_ref0_av1     = 0;
    regs->swreg13.sw_comp_pred_var_ref1_av1     = 0;
    regs->swreg14.sw_filt_level_seg0            = 0;
    regs->swreg15.sw_filt_level_seg1            = 0;
    regs->swreg16.sw_filt_level_seg2            = 0;
    regs->swreg17.sw_filt_level_seg3            = 0;
    regs->swreg18.sw_filt_level_seg4            = 0;
    regs->swreg19.sw_filt_level_seg5            = 0;
    regs->swreg31.sw_filt_level_seg6            = 0;
    regs->swreg32.sw_filt_level_seg7            = 0;


    regs->swreg13.sw_qp_delta_y_dc_av1          = dxva->quantization.y_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_dc_av1         = dxva->quantization.u_dc_delta_q;
    regs->swreg13.sw_qp_delta_ch_ac_av1         = dxva->quantization.u_ac_delta_q;
    regs->swreg47.sw_qmlevel_y                  = dxva->quantization.qm_y;
    regs->swreg48.sw_qmlevel_u                  = dxva->quantization.qm_u;
    regs->swreg49.sw_qmlevel_v                  = dxva->quantization.qm_v;

    regs->swreg13.sw_lossless_e                 = dxva->coded_lossless;
    regs->swreg28.sw_quant_delta_v_dc           = dxva->quantization.v_dc_delta_q;
    regs->swreg29.sw_quant_delta_v_ac           = dxva->quantization.v_ac_delta_q;

    regs->swreg31.sw_skip_ref0              = dxva->skip_ref0 ? dxva->skip_ref0 : 1;
    regs->swreg32.sw_skip_ref1              = dxva->skip_ref1 ? dxva->skip_ref1 : 1;

    /*input out put buf cfg*/
    {
        // RK_U32 out_w = MPP_ALIGN(4 * width * bit_depth, 128) / 8;
        // RK_U32 out_h = height / 4;
        // RK_U32 y_stride = out_w * out_h;
        // RK_U32 uv_stride = y_stride / 2;

        RK_U32 y_stride = ctx->luma_size;
        RK_U32 uv_stride = y_stride / 2;
        RK_U32 mv_offset = y_stride + uv_stride + 64;
        RK_U32 offset = (dxva->frame_tag_size & (~0xf));

        regs->addr_cfg.swreg65.sw_dec_out_ybase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);//mpp_buffer_get_fd(buffer);
        regs->addr_cfg.swreg99.sw_dec_out_cbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 99, y_stride);
        regs->addr_cfg.swreg133.sw_dec_out_dbase_lsb = mpp_buffer_get_fd(tile_out_buf->buf[0]);
        mpp_dev_set_reg_offset(p_hal->dev, 133, mv_offset);

        /*  if (ctx->fbc_en) {
              regs->swreg190.sw_dec_out_tybase_lsb = 0;// TODO:
              regs->swreg224.sw_dec_out_tcbase_lsb = 0;// TODO:
          }*/

        regs->swreg258.sw_strm_buffer_len = MPP_ALIGN(p_hal->strm_len, 128);//
        regs->swreg5.sw_strm_start_bit    =  (dxva->frame_tag_size & 0xf) * 8; // bit start to decode
        regs->swreg6.sw_stream_len  = MPP_ALIGN(p_hal->strm_len, 128);//p_hal->strm_len - offset;
        regs->swreg259.sw_strm_start_offset = 0;
        regs->addr_cfg.swreg168.sw_stream_base_msb = 0;
        regs->addr_cfg.swreg169.sw_stream_base_lsb = mpp_buffer_get_fd(streambuf);
        mpp_dev_set_reg_offset(p_hal->dev, 169, offset);

        AV1D_DBG(AV1D_DBG_LOG, "stream len %d\n", p_hal->strm_len);
        AV1D_DBG(AV1D_DBG_LOG, "stream offset %d\n", offset);
        AV1D_DBG(AV1D_DBG_LOG, "stream tag_size %d\n", dxva->frame_tag_size);
        AV1D_DBG(AV1D_DBG_LOG, "stream start_bit %d\n", regs->swreg5.sw_strm_start_bit);
    }
    regs->swreg314.sw_dec_alignment = 64;

    regs->addr_cfg.swreg175.sw_mc_sync_curr_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);
    regs->addr_cfg.swreg177.sw_mc_sync_left_base_lsb = mpp_buffer_get_fd(ctx->tile_buf);

    regs->swreg55.sw_apf_disable = 0;
    regs->swreg55.sw_apf_threshold = 8;
    regs->swreg58.sw_dec_buswidth = 2;
    regs->swreg58.sw_dec_max_burst = 16;
    regs->swreg266.sw_error_conceal_e                     = 0;
    regs->swreg265.sw_axi_rd_ostd_threshold               = 64;
    regs->swreg265.sw_axi_wr_ostd_threshold               = 64;

    regs->swreg318.sw_ext_timeout_cycles                  = 0xfffffff;
    regs->swreg318.sw_ext_timeout_override_e              = 1;
    regs->swreg319.sw_timeout_cycles                      = 0xfffffff;
    regs->swreg319.sw_timeout_override_e                  = 1;

    /* pp cfg */
    regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_e = 1;
    regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_in_format = 0;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_hor = 1;
    regs->vdpu_av1d_pp_cfg.swreg394.sw_pp0_dup_ver = 1;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_height = height / 2;
    regs->vdpu_av1d_pp_cfg.swreg331.sw_pp_in_width = width / 2;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_height = height;
    regs->vdpu_av1d_pp_cfg.swreg332.sw_pp_out_width = width;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = hor_stride;
    regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = hor_stride;

    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_y_stride = hor_stride;
    // regs->vdpu_av1d_pp_cfg.swreg337.sw_pp_in_c_stride = hor_stride;
    if (ctx->fbc_en) {
        RK_U32 vir_left = 0, vir_right = 0, vir_top = 0, vir_bottom = 0;
        RK_U32 bypass_filter = !regs->swreg5.sw_superres_is_scaled &&
                               !regs->swreg5.sw_enable_cdef &&
                               !regs->swreg14.sw_filt_level0 &&
                               !regs->swreg15.sw_filt_level1 &&
                               !regs->swreg18.sw_lr_type;

        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_y_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->vdpu_av1d_pp_cfg.swreg329.sw_pp_out_c_stride = dxva->bitdepth > 8 ?
                                                             width * 2 : width;
        regs->swreg58.sw_dec_axi_wd_id_e = 1;
        regs->swreg58.sw_dec_axi_rd_id_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg320.sw_pp_out_tile_e = 1;
        regs->vdpu_av1d_pp_cfg.swreg321.sw_pp_tile_size = 2;

        vir_left = 0;
        if (((vir_left + width) % 16))
            vir_right = 16 - ((vir_left + width) % 16);
        else
            vir_right = 0;

        if (!bypass_filter)
            vir_top = 8;
        else
            vir_top = 0;

        if (((vir_top + height) % 16))
            vir_bottom = 16 - ((vir_top + height) % 16);
        else
            vir_bottom = 0;

        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_top = vir_top;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_left = vir_left;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_bottom = vir_bottom;
        regs->vdpu_av1d_pp_cfg.swreg503.sw_pp0_virtual_right = vir_right;
        mpp_frame_set_offset_y(mframe, vir_top);
        mpp_frame_set_ver_stride(mframe, vir_top + height + vir_bottom);
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = 0;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg505.sw_pp0_afbc_tile_base_lsb = mpp_buffer_get_fd(buffer);
    } else {
        RK_U32 out_w = hor_stride;
        RK_U32 out_h = ver_stride;
        RK_U32 y_stride = out_w * out_h;
        RK_U32 out_fmt = 0;

        if ((mpp_frame_get_fmt(mframe) & MPP_FRAME_FMT_MASK) == MPP_FMT_YUV420SP)
            out_fmt = 3;

        /*
         * out_fmt:
         * 0 is 8bit or 10bit output by syntax
         * 3 is force 8bit output
         */
        regs->vdpu_av1d_pp_cfg.swreg322.sw_pp_out_format = out_fmt;
        regs->vdpu_av1d_pp_cfg.swreg326.sw_pp_out_lu_base_lsb = mpp_buffer_get_fd(buffer);
        regs->vdpu_av1d_pp_cfg.swreg328.sw_pp_out_ch_base_lsb = mpp_buffer_get_fd(buffer);
        mpp_dev_set_reg_offset(p_hal->dev, 328, y_stride);
    }

__RETURN:
    return ret = MPP_OK;
}